

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack8_fp16.h
# Opt level: O0

void ncnn::convdw3x3s2_fp16_pack8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  undefined1 auVar24 [32];
  __m256 _r22_2;
  __m256 _r21_2;
  __m256 _r20_2;
  __m256 _r12_2;
  __m256 _r11_2;
  __m256 _r10_2;
  __m256 _r02_2;
  __m256 _r01_2;
  __m256 _r00_2;
  __m256 _sum0_2;
  __m256 _r24_1;
  __m256 _r14_1;
  __m256 _r04_1;
  __m256 _r23_1;
  __m256 _r13_1;
  __m256 _r03_1;
  __m256 _sum1_1;
  __m256 _r22_1;
  __m256 _r21_1;
  __m256 _r20_1;
  __m256 _r12_1;
  __m256 _r11_1;
  __m256 _r10_1;
  __m256 _r02_1;
  __m256 _r01_1;
  __m256 _r00_1;
  __m256 _sum0_1;
  __m256 _r28;
  __m256 _r18;
  __m256 _r08;
  __m256 _r27;
  __m256 _r17;
  __m256 _r07;
  __m256 _sum3;
  __m256 _r26;
  __m256 _r16;
  __m256 _r06;
  __m256 _r25;
  __m256 _r15;
  __m256 _r05;
  __m256 _sum2;
  __m256 _r24;
  __m256 _r14;
  __m256 _r04;
  __m256 _r23;
  __m256 _r13;
  __m256 _r03;
  __m256 _sum1;
  __m256 _r22;
  __m256 _r21;
  __m256 _r20;
  __m256 _r12;
  __m256 _r11;
  __m256 _r10;
  __m256 _r02;
  __m256 _r01;
  __m256 _r00;
  __m256 _sum0;
  int j;
  int i;
  __m256 _k22;
  __m256 _k21;
  __m256 _k20;
  __m256 _k12;
  __m256 _k11;
  __m256 _k10;
  __m256 _k02;
  __m256 _k01;
  __m256 _k00;
  float *r2;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr0;
  unsigned_short *k0;
  __m256 _bias0;
  Mat out;
  int g;
  float *bias;
  int tailstep;
  int group;
  int outh;
  int outw;
  int w;
  undefined8 local_4e00;
  undefined8 uStack_4df8;
  undefined8 local_4de0;
  Mat *this;
  undefined8 local_4dc0;
  undefined8 uStack_4db8;
  undefined8 local_4da0;
  undefined8 uStack_4d98;
  undefined8 local_4d80;
  undefined8 uStack_4d78;
  undefined8 local_4d60;
  undefined8 uStack_4d58;
  undefined8 local_4d40;
  undefined8 uStack_4d38;
  undefined8 local_4d20;
  undefined8 uStack_4d18;
  undefined8 local_4d00;
  undefined8 uStack_4cf8;
  undefined8 local_4bc0;
  undefined8 uStack_4bb8;
  undefined8 local_4ba0;
  undefined8 uStack_4b98;
  undefined8 local_4b80;
  undefined8 uStack_4b78;
  undefined8 local_4b60;
  undefined8 uStack_4b58;
  undefined8 local_4b40;
  undefined8 uStack_4b38;
  undefined8 local_4b20;
  undefined8 uStack_4b18;
  undefined8 local_4b00;
  undefined8 uStack_4af8;
  undefined8 local_4ae0;
  undefined8 uStack_4ad8;
  undefined8 local_4ac0;
  undefined8 uStack_4ab8;
  undefined8 local_49e0;
  undefined8 uStack_49d8;
  undefined8 local_49c0;
  undefined8 uStack_49b8;
  undefined8 local_49a0;
  undefined8 uStack_4998;
  undefined8 local_4980;
  undefined8 uStack_4978;
  undefined8 local_4960;
  undefined8 uStack_4958;
  undefined8 local_4940;
  undefined8 uStack_4938;
  undefined8 local_4920;
  undefined8 uStack_4918;
  undefined8 local_4900;
  undefined8 uStack_48f8;
  undefined8 local_48e0;
  undefined8 uStack_48d8;
  undefined8 local_47a0;
  undefined8 uStack_4798;
  undefined8 local_4780;
  undefined8 uStack_4778;
  undefined8 local_4760;
  undefined8 uStack_4758;
  undefined8 local_4740;
  undefined8 uStack_4738;
  undefined8 local_4720;
  undefined8 uStack_4718;
  undefined8 local_4700;
  undefined8 uStack_46f8;
  undefined8 local_46e0;
  undefined8 uStack_46d8;
  undefined8 local_46c0;
  undefined8 uStack_46b8;
  undefined8 local_46a0;
  undefined8 uStack_4698;
  undefined8 local_45c0;
  undefined8 uStack_45b8;
  undefined8 local_45a0;
  undefined8 uStack_4598;
  undefined8 local_4580;
  undefined8 uStack_4578;
  undefined8 local_4560;
  undefined8 uStack_4558;
  undefined8 local_4540;
  undefined8 uStack_4538;
  undefined8 local_4520;
  undefined8 uStack_4518;
  undefined8 local_4500;
  undefined8 uStack_44f8;
  undefined8 local_44e0;
  undefined8 uStack_44d8;
  undefined8 local_44c0;
  undefined8 uStack_44b8;
  undefined8 local_43e0;
  undefined8 uStack_43d8;
  undefined8 local_43c0;
  undefined8 uStack_43b8;
  undefined8 local_43a0;
  undefined8 uStack_4398;
  undefined8 local_4380;
  undefined8 uStack_4378;
  undefined8 local_4360;
  undefined8 uStack_4358;
  undefined8 local_4340;
  undefined8 uStack_4338;
  undefined8 local_4320;
  undefined8 uStack_4318;
  undefined8 local_4300;
  undefined8 uStack_42f8;
  undefined8 local_42e0;
  undefined8 uStack_42d8;
  undefined8 local_4200;
  undefined8 uStack_41f8;
  undefined8 local_41e0;
  undefined8 uStack_41d8;
  undefined8 local_41c0;
  undefined8 uStack_41b8;
  undefined8 local_41a0;
  undefined8 uStack_4198;
  undefined8 local_4180;
  undefined8 uStack_4178;
  undefined8 local_4160;
  undefined8 uStack_4158;
  undefined8 local_4140;
  undefined8 uStack_4138;
  undefined8 local_4120;
  undefined8 uStack_4118;
  undefined8 local_4100;
  undefined8 uStack_40f8;
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  undefined8 local_3fa0;
  undefined8 uStack_3f98;
  undefined8 uStack_3f90;
  undefined8 uStack_3f88;
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  undefined8 local_3f60;
  undefined8 uStack_3f58;
  undefined8 uStack_3f50;
  undefined8 uStack_3f48;
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 uStack_3f30;
  undefined8 uStack_3f28;
  undefined8 local_3f20;
  undefined8 uStack_3f18;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  undefined8 local_3ee0;
  undefined8 uStack_3ed8;
  undefined8 uStack_3ed0;
  undefined8 uStack_3ec8;
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  undefined8 local_3e40;
  undefined8 uStack_3e38;
  undefined8 uStack_3e30;
  undefined8 uStack_3e28;
  int local_36a8;
  int local_36a4;
  undefined1 (*local_3580) [32];
  undefined1 (*local_3578) [32];
  undefined1 (*local_3570) [32];
  Mat local_3568;
  float *local_3520;
  undefined1 (*local_3518) [16];
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  Mat local_34e0;
  int local_3494;
  float *local_3490;
  int local_3484;
  int local_3480;
  int local_347c;
  int local_3478;
  int local_3474;
  Mat *local_3460;
  undefined4 local_3444;
  undefined1 (*local_3440) [32];
  undefined1 (*local_3438) [32];
  undefined1 (*local_3430) [32];
  undefined1 (*local_3428) [32];
  undefined1 (*local_3420) [32];
  undefined1 (*local_3418) [32];
  undefined1 (*local_3410) [32];
  undefined1 (*local_3408) [32];
  undefined1 (*local_3400) [32];
  undefined1 (*local_33f8) [32];
  undefined1 (*local_33f0) [32];
  undefined1 (*local_33e8) [32];
  undefined1 (*local_33e0) [32];
  undefined1 (*local_33d8) [32];
  undefined1 (*local_33d0) [32];
  undefined1 (*local_33c8) [32];
  undefined1 (*local_33c0) [32];
  undefined1 (*local_33b8) [32];
  undefined1 (*local_33b0) [32];
  undefined1 (*local_33a8) [32];
  undefined1 (*local_33a0) [32];
  undefined1 (*local_3398) [32];
  undefined1 (*local_3390) [32];
  undefined1 (*local_3388) [32];
  undefined1 (*local_3380) [32];
  undefined1 (*local_3378) [32];
  undefined1 (*local_3370) [32];
  undefined1 (*local_3368) [32];
  undefined1 (*local_3360) [32];
  undefined1 (*local_3358) [32];
  undefined1 (*local_3350) [32];
  undefined1 (*local_3348) [32];
  undefined1 (*local_3340) [32];
  undefined1 (*local_3338) [32];
  undefined1 (*local_3330) [32];
  undefined1 (*local_3328) [32];
  undefined1 (*local_3320) [32];
  undefined1 (*local_3318) [32];
  undefined1 (*local_3310) [32];
  undefined1 (*local_3308) [32];
  undefined1 (*local_3300) [32];
  undefined1 (*local_32f8) [32];
  undefined1 (*local_32f0) [32];
  undefined1 (*local_32e8) [32];
  undefined1 (*local_32e0) [32];
  undefined1 (*local_32d8) [32];
  undefined1 (*local_32d0) [32];
  undefined1 (*local_32c8) [32];
  undefined1 (*local_32c0) [32];
  undefined1 (*local_32b8) [32];
  undefined1 (*local_32b0) [32];
  float *local_32a8;
  undefined8 local_32a0;
  undefined8 uStack_3298;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  undefined8 local_3260;
  undefined8 uStack_3258;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined8 local_3220;
  undefined8 uStack_3218;
  undefined8 uStack_3210;
  undefined8 uStack_3208;
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 local_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 local_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  undefined8 local_3060;
  undefined8 uStack_3058;
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined8 local_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  undefined8 local_3000;
  undefined8 uStack_2ff8;
  undefined8 uStack_2ff0;
  undefined8 uStack_2fe8;
  undefined8 local_2fe0;
  undefined8 uStack_2fd8;
  undefined8 uStack_2fd0;
  undefined8 uStack_2fc8;
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  undefined8 local_2fa0;
  undefined8 uStack_2f98;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined8 local_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined8 local_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  undefined8 local_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  undefined8 local_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined8 local_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 local_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 local_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined8 local_2d20;
  undefined8 uStack_2d18;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 local_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 local_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 local_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined8 local_2c20;
  undefined8 uStack_2c18;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  undefined8 local_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 local_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 local_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 local_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  float *local_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  float *local_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  float *local_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  float *local_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  float *local_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  float *local_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  float *local_1950;
  undefined1 (*local_1948) [16];
  undefined1 (*local_1940) [16];
  undefined1 (*local_1938) [16];
  undefined1 (*local_1930) [16];
  undefined1 (*local_1928) [16];
  undefined1 (*local_1920) [16];
  undefined1 (*local_1918) [16];
  undefined1 (*local_1910) [16];
  undefined1 (*local_1908) [16];
  undefined1 local_1900 [16];
  undefined1 local_18f0 [16];
  undefined1 local_18e0 [16];
  undefined1 local_18d0 [16];
  undefined1 local_18c0 [16];
  undefined1 local_18b0 [16];
  undefined1 local_18a0 [16];
  undefined1 local_1890 [16];
  undefined1 local_1880 [16];
  undefined1 (*local_1868) [16];
  undefined1 (*local_1860) [16];
  undefined1 (*local_1858) [16];
  undefined1 (*local_1850) [16];
  undefined1 (*local_1848) [16];
  undefined1 (*local_1840) [16];
  undefined1 (*local_1838) [16];
  undefined1 (*local_1830) [16];
  undefined1 (*local_1828) [16];
  undefined1 local_1820 [32];
  undefined4 local_1800;
  undefined4 local_17fc;
  undefined4 local_17f8;
  undefined4 local_17f4;
  undefined4 local_17f0;
  undefined4 local_17ec;
  undefined4 local_17e8;
  undefined4 local_17e4;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  local_3474 = *(int *)(in_RDI + 0x2c);
  local_3478 = *(int *)(in_RSI + 0x2c);
  local_347c = *(int *)(in_RSI + 0x30);
  local_3480 = *(int *)(in_RDI + 0x38);
  local_3484 = (local_3474 * 2 + local_3478 * -2) * 8;
  local_3460 = in_RDX;
  local_3490 = Mat::operator_cast_to_float_(in_RCX);
  for (local_3494 = 0; local_3494 < local_3480; local_3494 = local_3494 + 1) {
    Mat::channel(this,local_4de0._12_4_);
    if (local_3490 == (float *)0x0) {
      local_3444 = 0;
      local_17e4 = 0;
      local_17e8 = 0;
      local_17ec = 0;
      local_17f0 = 0;
      local_17f4 = 0;
      local_17f8 = 0;
      local_17fc = 0;
      local_1800 = 0;
      auVar9 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(0),0x20);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(0),0x30);
      auVar10 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar10 = vinsertps_avx(auVar10,ZEXT416(0),0x20);
      auVar10 = vinsertps_avx(auVar10,ZEXT416(0),0x30);
      auVar24._16_16_ = auVar9;
      auVar24._0_16_ = auVar10;
      local_1820._0_8_ = auVar10._0_8_;
      local_1820._8_8_ = auVar10._8_8_;
      local_1820._16_8_ = auVar9._0_8_;
      local_1820._24_8_ = auVar9._8_8_;
      local_3e40 = local_1820._0_8_;
      uStack_3e38 = local_1820._8_8_;
      uStack_3e30 = local_1820._16_8_;
      uStack_3e28 = local_1820._24_8_;
      local_1820 = auVar24;
    }
    else {
      local_32a8 = local_3490 + (local_3494 << 3);
      local_3e40 = *(undefined8 *)local_32a8;
      uStack_3e38 = *(undefined8 *)(local_32a8 + 2);
      uStack_3e30 = *(undefined8 *)(local_32a8 + 4);
      uStack_3e28 = *(undefined8 *)(local_32a8 + 6);
    }
    local_3500 = local_3e40;
    uStack_34f8 = uStack_3e38;
    uStack_34f0 = uStack_3e30;
    uStack_34e8 = uStack_3e28;
    local_3518 = (undefined1 (*) [16])Mat::row(local_3460,local_3494);
    local_3520 = Mat::row(&local_34e0,0);
    Mat::channel(this,local_4de0._12_4_);
    local_3570 = (undefined1 (*) [32])Mat::row(&local_3568,0);
    local_3578 = (undefined1 (*) [32])Mat::row(&local_3568,1);
    local_3580 = (undefined1 (*) [32])Mat::row(&local_3568,2);
    local_1908 = local_3518;
    local_1868 = local_3518;
    local_1900 = vlddqu_avx(*local_3518);
    auVar24 = vcvtph2ps_f16c(local_1900);
    local_3ec0 = auVar24._0_8_;
    uStack_3eb8 = auVar24._8_8_;
    uStack_3eb0 = auVar24._16_8_;
    uStack_3ea8 = auVar24._24_8_;
    local_1910 = local_3518 + 1;
    local_18f0 = vlddqu_avx(*local_1910);
    auVar1 = vcvtph2ps_f16c(local_18f0);
    local_3ee0 = auVar1._0_8_;
    uStack_3ed8 = auVar1._8_8_;
    uStack_3ed0 = auVar1._16_8_;
    uStack_3ec8 = auVar1._24_8_;
    local_1918 = local_3518 + 2;
    local_18e0 = vlddqu_avx(*local_1918);
    auVar2 = vcvtph2ps_f16c(local_18e0);
    local_3f00 = auVar2._0_8_;
    uStack_3ef8 = auVar2._8_8_;
    uStack_3ef0 = auVar2._16_8_;
    uStack_3ee8 = auVar2._24_8_;
    local_1920 = local_3518 + 3;
    local_18d0 = vlddqu_avx(*local_1920);
    auVar3 = vcvtph2ps_f16c(local_18d0);
    local_3f20 = auVar3._0_8_;
    uStack_3f18 = auVar3._8_8_;
    uStack_3f10 = auVar3._16_8_;
    uStack_3f08 = auVar3._24_8_;
    local_1928 = local_3518 + 4;
    local_18c0 = vlddqu_avx(*local_1928);
    auVar4 = vcvtph2ps_f16c(local_18c0);
    local_3f40 = auVar4._0_8_;
    uStack_3f38 = auVar4._8_8_;
    uStack_3f30 = auVar4._16_8_;
    uStack_3f28 = auVar4._24_8_;
    local_1930 = local_3518 + 5;
    local_18b0 = vlddqu_avx(*local_1930);
    auVar5 = vcvtph2ps_f16c(local_18b0);
    local_3f60 = auVar5._0_8_;
    uStack_3f58 = auVar5._8_8_;
    uStack_3f50 = auVar5._16_8_;
    uStack_3f48 = auVar5._24_8_;
    local_1938 = local_3518 + 6;
    local_18a0 = vlddqu_avx(*local_1938);
    auVar6 = vcvtph2ps_f16c(local_18a0);
    local_3f80 = auVar6._0_8_;
    uStack_3f78 = auVar6._8_8_;
    uStack_3f70 = auVar6._16_8_;
    uStack_3f68 = auVar6._24_8_;
    local_1940 = local_3518 + 7;
    local_1890 = vlddqu_avx(*local_1940);
    auVar7 = vcvtph2ps_f16c(local_1890);
    local_3fa0 = auVar7._0_8_;
    uStack_3f98 = auVar7._8_8_;
    uStack_3f90 = auVar7._16_8_;
    uStack_3f88 = auVar7._24_8_;
    local_1948 = local_3518 + 8;
    local_1880 = vlddqu_avx(*local_1948);
    auVar8 = vcvtph2ps_f16c(local_1880);
    local_3fc0 = auVar8._0_8_;
    uStack_3fb8 = auVar8._8_8_;
    uStack_3fb0 = auVar8._16_8_;
    uStack_3fa8 = auVar8._24_8_;
    for (local_36a4 = 0; local_36a4 < local_347c; local_36a4 = local_36a4 + 1) {
      for (local_36a8 = 0; local_36a8 + 3 < local_3478; local_36a8 = local_36a8 + 4) {
        local_32b0 = local_3570;
        local_1b40 = *(undefined8 *)*local_3570;
        uStack_1b38 = *(undefined8 *)(*local_3570 + 8);
        uStack_1b30 = *(undefined8 *)(*local_3570 + 0x10);
        uStack_1b28 = *(undefined8 *)(*local_3570 + 0x18);
        local_32b8 = local_3570 + 1;
        local_1ba0 = *(undefined8 *)*local_32b8;
        uStack_1b98 = *(undefined8 *)(local_3570[1] + 8);
        uStack_1b90 = *(undefined8 *)(local_3570[1] + 0x10);
        uStack_1b88 = *(undefined8 *)(local_3570[1] + 0x18);
        local_32c0 = local_3570 + 2;
        local_1ea0 = *(undefined8 *)*local_32c0;
        uStack_1e98 = *(undefined8 *)(local_3570[2] + 8);
        uStack_1e90 = *(undefined8 *)(local_3570[2] + 0x10);
        uStack_1e88 = *(undefined8 *)(local_3570[2] + 0x18);
        auVar12 = *local_32c0;
        local_32c8 = local_3578;
        local_1c60 = *(undefined8 *)*local_3578;
        uStack_1c58 = *(undefined8 *)(*local_3578 + 8);
        uStack_1c50 = *(undefined8 *)(*local_3578 + 0x10);
        uStack_1c48 = *(undefined8 *)(*local_3578 + 0x18);
        local_32d0 = local_3578 + 1;
        local_1cc0 = *(undefined8 *)*local_32d0;
        uStack_1cb8 = *(undefined8 *)(local_3578[1] + 8);
        uStack_1cb0 = *(undefined8 *)(local_3578[1] + 0x10);
        uStack_1ca8 = *(undefined8 *)(local_3578[1] + 0x18);
        local_32d8 = local_3578 + 2;
        local_1fc0 = *(undefined8 *)*local_32d8;
        uStack_1fb8 = *(undefined8 *)(local_3578[2] + 8);
        uStack_1fb0 = *(undefined8 *)(local_3578[2] + 0x10);
        uStack_1fa8 = *(undefined8 *)(local_3578[2] + 0x18);
        auVar14 = *local_32d8;
        local_32e0 = local_3580;
        local_1d80 = *(undefined8 *)*local_3580;
        uStack_1d78 = *(undefined8 *)(*local_3580 + 8);
        uStack_1d70 = *(undefined8 *)(*local_3580 + 0x10);
        uStack_1d68 = *(undefined8 *)(*local_3580 + 0x18);
        local_32e8 = local_3580 + 1;
        local_1de0 = *(undefined8 *)*local_32e8;
        uStack_1dd8 = *(undefined8 *)(local_3580[1] + 8);
        uStack_1dd0 = *(undefined8 *)(local_3580[1] + 0x10);
        uStack_1dc8 = *(undefined8 *)(local_3580[1] + 0x18);
        local_32f0 = local_3580 + 2;
        local_20e0 = *(undefined8 *)*local_32f0;
        uStack_20d8 = *(undefined8 *)(local_3580[2] + 8);
        uStack_20d0 = *(undefined8 *)(local_3580[2] + 0x10);
        uStack_20c8 = *(undefined8 *)(local_3580[2] + 0x18);
        auVar17 = *local_32f0;
        local_1b20 = local_3ec0;
        uStack_1b18 = uStack_3eb8;
        uStack_1b10 = uStack_3eb0;
        uStack_1b08 = uStack_3ea8;
        local_1b60 = local_3500;
        uStack_1b58 = uStack_34f8;
        uStack_1b50 = uStack_34f0;
        uStack_1b48 = uStack_34e8;
        local_17a0 = local_3ec0;
        uStack_1798 = uStack_3eb8;
        uStack_1790 = uStack_3eb0;
        uStack_1788 = uStack_3ea8;
        local_17e0 = local_3500;
        uStack_17d8 = uStack_34f8;
        uStack_17d0 = uStack_34f0;
        uStack_17c8 = uStack_34e8;
        auVar23._8_8_ = uStack_34f8;
        auVar23._0_8_ = local_3500;
        auVar23._16_8_ = uStack_34f0;
        auVar23._24_8_ = uStack_34e8;
        auVar9 = vfmadd213ps_fma(*local_3570,auVar24,auVar23);
        local_4100 = auVar9._0_8_;
        uStack_40f8 = auVar9._8_8_;
        local_1b80 = local_3ee0;
        uStack_1b78 = uStack_3ed8;
        uStack_1b70 = uStack_3ed0;
        uStack_1b68 = uStack_3ec8;
        local_1bc0 = local_4100;
        uStack_1bb8 = uStack_40f8;
        uStack_1bb0 = 0;
        uStack_1ba8 = 0;
        local_1740 = local_3ee0;
        uStack_1738 = uStack_3ed8;
        uStack_1730 = uStack_3ed0;
        uStack_1728 = uStack_3ec8;
        local_1780 = local_4100;
        uStack_1778 = uStack_40f8;
        uStack_1770 = 0;
        uStack_1768 = 0;
        auVar9 = vfmadd213ps_fma(*local_32b8,auVar1,ZEXT1632(auVar9));
        local_4120 = auVar9._0_8_;
        uStack_4118 = auVar9._8_8_;
        local_1be0 = local_3f00;
        uStack_1bd8 = uStack_3ef8;
        uStack_1bd0 = uStack_3ef0;
        uStack_1bc8 = uStack_3ee8;
        local_1c20 = local_4120;
        uStack_1c18 = uStack_4118;
        uStack_1c10 = 0;
        uStack_1c08 = 0;
        local_16e0 = local_3f00;
        uStack_16d8 = uStack_3ef8;
        uStack_16d0 = uStack_3ef0;
        uStack_16c8 = uStack_3ee8;
        local_1720 = local_4120;
        uStack_1718 = uStack_4118;
        uStack_1710 = 0;
        uStack_1708 = 0;
        auVar9 = vfmadd213ps_fma(*local_32c0,auVar2,ZEXT1632(auVar9));
        local_4140 = auVar9._0_8_;
        uStack_4138 = auVar9._8_8_;
        local_1c40 = local_3f20;
        uStack_1c38 = uStack_3f18;
        uStack_1c30 = uStack_3f10;
        uStack_1c28 = uStack_3f08;
        local_1c80 = local_4140;
        uStack_1c78 = uStack_4138;
        uStack_1c70 = 0;
        uStack_1c68 = 0;
        local_1680 = local_3f20;
        uStack_1678 = uStack_3f18;
        uStack_1670 = uStack_3f10;
        uStack_1668 = uStack_3f08;
        local_16c0 = local_4140;
        uStack_16b8 = uStack_4138;
        uStack_16b0 = 0;
        uStack_16a8 = 0;
        auVar9 = vfmadd213ps_fma(*local_3578,auVar3,ZEXT1632(auVar9));
        local_4160 = auVar9._0_8_;
        uStack_4158 = auVar9._8_8_;
        local_1ca0 = local_3f40;
        uStack_1c98 = uStack_3f38;
        uStack_1c90 = uStack_3f30;
        uStack_1c88 = uStack_3f28;
        local_1ce0 = local_4160;
        uStack_1cd8 = uStack_4158;
        uStack_1cd0 = 0;
        uStack_1cc8 = 0;
        local_1620 = local_3f40;
        uStack_1618 = uStack_3f38;
        uStack_1610 = uStack_3f30;
        uStack_1608 = uStack_3f28;
        local_1660 = local_4160;
        uStack_1658 = uStack_4158;
        uStack_1650 = 0;
        uStack_1648 = 0;
        auVar9 = vfmadd213ps_fma(*local_32d0,auVar4,ZEXT1632(auVar9));
        local_4180 = auVar9._0_8_;
        uStack_4178 = auVar9._8_8_;
        local_1d00 = local_3f60;
        uStack_1cf8 = uStack_3f58;
        uStack_1cf0 = uStack_3f50;
        uStack_1ce8 = uStack_3f48;
        local_1d40 = local_4180;
        uStack_1d38 = uStack_4178;
        uStack_1d30 = 0;
        uStack_1d28 = 0;
        local_15c0 = local_3f60;
        uStack_15b8 = uStack_3f58;
        uStack_15b0 = uStack_3f50;
        uStack_15a8 = uStack_3f48;
        local_1600 = local_4180;
        uStack_15f8 = uStack_4178;
        uStack_15f0 = 0;
        uStack_15e8 = 0;
        auVar9 = vfmadd213ps_fma(*local_32d8,auVar5,ZEXT1632(auVar9));
        local_41a0 = auVar9._0_8_;
        uStack_4198 = auVar9._8_8_;
        local_1d60 = local_3f80;
        uStack_1d58 = uStack_3f78;
        uStack_1d50 = uStack_3f70;
        uStack_1d48 = uStack_3f68;
        local_1da0 = local_41a0;
        uStack_1d98 = uStack_4198;
        uStack_1d90 = 0;
        uStack_1d88 = 0;
        local_1560 = local_3f80;
        uStack_1558 = uStack_3f78;
        uStack_1550 = uStack_3f70;
        uStack_1548 = uStack_3f68;
        local_15a0 = local_41a0;
        uStack_1598 = uStack_4198;
        uStack_1590 = 0;
        uStack_1588 = 0;
        auVar9 = vfmadd213ps_fma(*local_3580,auVar6,ZEXT1632(auVar9));
        local_41c0 = auVar9._0_8_;
        uStack_41b8 = auVar9._8_8_;
        local_1dc0 = local_3fa0;
        uStack_1db8 = uStack_3f98;
        uStack_1db0 = uStack_3f90;
        uStack_1da8 = uStack_3f88;
        local_1e00 = local_41c0;
        uStack_1df8 = uStack_41b8;
        uStack_1df0 = 0;
        uStack_1de8 = 0;
        local_1500 = local_3fa0;
        uStack_14f8 = uStack_3f98;
        uStack_14f0 = uStack_3f90;
        uStack_14e8 = uStack_3f88;
        local_1540 = local_41c0;
        uStack_1538 = uStack_41b8;
        uStack_1530 = 0;
        uStack_1528 = 0;
        auVar9 = vfmadd213ps_fma(*local_32e8,auVar7,ZEXT1632(auVar9));
        local_41e0 = auVar9._0_8_;
        uStack_41d8 = auVar9._8_8_;
        local_1e20 = local_3fc0;
        uStack_1e18 = uStack_3fb8;
        uStack_1e10 = uStack_3fb0;
        uStack_1e08 = uStack_3fa8;
        local_1e60 = local_41e0;
        uStack_1e58 = uStack_41d8;
        uStack_1e50 = 0;
        uStack_1e48 = 0;
        local_14a0 = local_3fc0;
        uStack_1498 = uStack_3fb8;
        uStack_1490 = uStack_3fb0;
        uStack_1488 = uStack_3fa8;
        local_14e0 = local_41e0;
        uStack_14d8 = uStack_41d8;
        uStack_14d0 = 0;
        uStack_14c8 = 0;
        auVar9 = vfmadd213ps_fma(*local_32f0,auVar8,ZEXT1632(auVar9));
        local_4200 = auVar9._0_8_;
        uStack_41f8 = auVar9._8_8_;
        local_32f8 = local_3570 + 3;
        local_1f00 = *(undefined8 *)*local_32f8;
        uStack_1ef8 = *(undefined8 *)(local_3570[3] + 8);
        uStack_1ef0 = *(undefined8 *)(local_3570[3] + 0x10);
        uStack_1ee8 = *(undefined8 *)(local_3570[3] + 0x18);
        auVar23 = *local_32f8;
        local_3300 = local_3578 + 3;
        local_2020 = *(undefined8 *)*local_3300;
        uStack_2018 = *(undefined8 *)(local_3578[3] + 8);
        uStack_2010 = *(undefined8 *)(local_3578[3] + 0x10);
        uStack_2008 = *(undefined8 *)(local_3578[3] + 0x18);
        auVar15 = *local_3300;
        local_3308 = local_3580 + 3;
        local_2140 = *(undefined8 *)*local_3308;
        uStack_2138 = *(undefined8 *)(local_3580[3] + 8);
        uStack_2130 = *(undefined8 *)(local_3580[3] + 0x10);
        uStack_2128 = *(undefined8 *)(local_3580[3] + 0x18);
        auVar18 = *local_3308;
        local_3310 = local_3570 + 4;
        local_2200 = *(undefined8 *)*local_3310;
        uStack_21f8 = *(undefined8 *)(local_3570[4] + 8);
        uStack_21f0 = *(undefined8 *)(local_3570[4] + 0x10);
        uStack_21e8 = *(undefined8 *)(local_3570[4] + 0x18);
        auVar20 = *local_3310;
        auVar13 = *local_3310;
        local_3318 = local_3578 + 4;
        local_2320 = *(undefined8 *)*local_3318;
        uStack_2318 = *(undefined8 *)(local_3578[4] + 8);
        uStack_2310 = *(undefined8 *)(local_3578[4] + 0x10);
        uStack_2308 = *(undefined8 *)(local_3578[4] + 0x18);
        auVar21 = *local_3318;
        auVar16 = *local_3318;
        local_3320 = local_3580 + 4;
        local_2440 = *(undefined8 *)*local_3320;
        uStack_2438 = *(undefined8 *)(local_3580[4] + 8);
        uStack_2430 = *(undefined8 *)(local_3580[4] + 0x10);
        uStack_2428 = *(undefined8 *)(local_3580[4] + 0x18);
        auVar22 = *local_3320;
        auVar19 = *local_3320;
        local_1950 = local_3520;
        local_1980 = local_4200;
        uStack_1978 = uStack_41f8;
        uStack_1970 = 0;
        uStack_1968 = 0;
        *(undefined8 *)local_3520 = local_4200;
        *(undefined8 *)(local_3520 + 2) = uStack_41f8;
        local_1950[4] = 0.0;
        local_1950[5] = 0.0;
        local_1950[6] = 0.0;
        local_1950[7] = 0.0;
        local_1e80 = local_3ec0;
        uStack_1e78 = uStack_3eb8;
        uStack_1e70 = uStack_3eb0;
        uStack_1e68 = uStack_3ea8;
        local_1ec0 = local_3500;
        uStack_1eb8 = uStack_34f8;
        uStack_1eb0 = uStack_34f0;
        uStack_1ea8 = uStack_34e8;
        local_1440 = local_3ec0;
        uStack_1438 = uStack_3eb8;
        uStack_1430 = uStack_3eb0;
        uStack_1428 = uStack_3ea8;
        local_1480 = local_3500;
        uStack_1478 = uStack_34f8;
        uStack_1470 = uStack_34f0;
        uStack_1468 = uStack_34e8;
        auVar11._8_8_ = uStack_34f8;
        auVar11._0_8_ = local_3500;
        auVar11._16_8_ = uStack_34f0;
        auVar11._24_8_ = uStack_34e8;
        auVar9 = vfmadd213ps_fma(auVar12,auVar24,auVar11);
        local_42e0 = auVar9._0_8_;
        uStack_42d8 = auVar9._8_8_;
        local_1ee0 = local_3ee0;
        uStack_1ed8 = uStack_3ed8;
        uStack_1ed0 = uStack_3ed0;
        uStack_1ec8 = uStack_3ec8;
        local_1f20 = local_42e0;
        uStack_1f18 = uStack_42d8;
        uStack_1f10 = 0;
        uStack_1f08 = 0;
        local_13e0 = local_3ee0;
        uStack_13d8 = uStack_3ed8;
        uStack_13d0 = uStack_3ed0;
        uStack_13c8 = uStack_3ec8;
        local_1420 = local_42e0;
        uStack_1418 = uStack_42d8;
        uStack_1410 = 0;
        uStack_1408 = 0;
        auVar9 = vfmadd213ps_fma(auVar23,auVar1,ZEXT1632(auVar9));
        local_4300 = auVar9._0_8_;
        uStack_42f8 = auVar9._8_8_;
        local_1f40 = local_3f00;
        uStack_1f38 = uStack_3ef8;
        uStack_1f30 = uStack_3ef0;
        uStack_1f28 = uStack_3ee8;
        local_1f80 = local_4300;
        uStack_1f78 = uStack_42f8;
        uStack_1f70 = 0;
        uStack_1f68 = 0;
        local_1380 = local_3f00;
        uStack_1378 = uStack_3ef8;
        uStack_1370 = uStack_3ef0;
        uStack_1368 = uStack_3ee8;
        local_13c0 = local_4300;
        uStack_13b8 = uStack_42f8;
        uStack_13b0 = 0;
        uStack_13a8 = 0;
        auVar9 = vfmadd213ps_fma(auVar13,auVar2,ZEXT1632(auVar9));
        local_4320 = auVar9._0_8_;
        uStack_4318 = auVar9._8_8_;
        local_1fa0 = local_3f20;
        uStack_1f98 = uStack_3f18;
        uStack_1f90 = uStack_3f10;
        uStack_1f88 = uStack_3f08;
        local_1fe0 = local_4320;
        uStack_1fd8 = uStack_4318;
        uStack_1fd0 = 0;
        uStack_1fc8 = 0;
        local_1320 = local_3f20;
        uStack_1318 = uStack_3f18;
        uStack_1310 = uStack_3f10;
        uStack_1308 = uStack_3f08;
        local_1360 = local_4320;
        uStack_1358 = uStack_4318;
        uStack_1350 = 0;
        uStack_1348 = 0;
        auVar9 = vfmadd213ps_fma(auVar14,auVar3,ZEXT1632(auVar9));
        local_4340 = auVar9._0_8_;
        uStack_4338 = auVar9._8_8_;
        local_2000 = local_3f40;
        uStack_1ff8 = uStack_3f38;
        uStack_1ff0 = uStack_3f30;
        uStack_1fe8 = uStack_3f28;
        local_2040 = local_4340;
        uStack_2038 = uStack_4338;
        uStack_2030 = 0;
        uStack_2028 = 0;
        local_12c0 = local_3f40;
        uStack_12b8 = uStack_3f38;
        uStack_12b0 = uStack_3f30;
        uStack_12a8 = uStack_3f28;
        local_1300 = local_4340;
        uStack_12f8 = uStack_4338;
        uStack_12f0 = 0;
        uStack_12e8 = 0;
        auVar9 = vfmadd213ps_fma(auVar15,auVar4,ZEXT1632(auVar9));
        local_4360 = auVar9._0_8_;
        uStack_4358 = auVar9._8_8_;
        local_2060 = local_3f60;
        uStack_2058 = uStack_3f58;
        uStack_2050 = uStack_3f50;
        uStack_2048 = uStack_3f48;
        local_20a0 = local_4360;
        uStack_2098 = uStack_4358;
        uStack_2090 = 0;
        uStack_2088 = 0;
        local_1260 = local_3f60;
        uStack_1258 = uStack_3f58;
        uStack_1250 = uStack_3f50;
        uStack_1248 = uStack_3f48;
        local_12a0 = local_4360;
        uStack_1298 = uStack_4358;
        uStack_1290 = 0;
        uStack_1288 = 0;
        auVar9 = vfmadd213ps_fma(auVar16,auVar5,ZEXT1632(auVar9));
        local_4380 = auVar9._0_8_;
        uStack_4378 = auVar9._8_8_;
        local_20c0 = local_3f80;
        uStack_20b8 = uStack_3f78;
        uStack_20b0 = uStack_3f70;
        uStack_20a8 = uStack_3f68;
        local_2100 = local_4380;
        uStack_20f8 = uStack_4378;
        uStack_20f0 = 0;
        uStack_20e8 = 0;
        local_1200 = local_3f80;
        uStack_11f8 = uStack_3f78;
        uStack_11f0 = uStack_3f70;
        uStack_11e8 = uStack_3f68;
        local_1240 = local_4380;
        uStack_1238 = uStack_4378;
        uStack_1230 = 0;
        uStack_1228 = 0;
        auVar9 = vfmadd213ps_fma(auVar17,auVar6,ZEXT1632(auVar9));
        local_43a0 = auVar9._0_8_;
        uStack_4398 = auVar9._8_8_;
        local_2120 = local_3fa0;
        uStack_2118 = uStack_3f98;
        uStack_2110 = uStack_3f90;
        uStack_2108 = uStack_3f88;
        local_2160 = local_43a0;
        uStack_2158 = uStack_4398;
        uStack_2150 = 0;
        uStack_2148 = 0;
        local_11a0 = local_3fa0;
        uStack_1198 = uStack_3f98;
        uStack_1190 = uStack_3f90;
        uStack_1188 = uStack_3f88;
        local_11e0 = local_43a0;
        uStack_11d8 = uStack_4398;
        uStack_11d0 = 0;
        uStack_11c8 = 0;
        auVar9 = vfmadd213ps_fma(auVar18,auVar7,ZEXT1632(auVar9));
        local_43c0 = auVar9._0_8_;
        uStack_43b8 = auVar9._8_8_;
        local_2180 = local_3fc0;
        uStack_2178 = uStack_3fb8;
        uStack_2170 = uStack_3fb0;
        uStack_2168 = uStack_3fa8;
        local_21c0 = local_43c0;
        uStack_21b8 = uStack_43b8;
        uStack_21b0 = 0;
        uStack_21a8 = 0;
        local_1140 = local_3fc0;
        uStack_1138 = uStack_3fb8;
        uStack_1130 = uStack_3fb0;
        uStack_1128 = uStack_3fa8;
        local_1180 = local_43c0;
        uStack_1178 = uStack_43b8;
        uStack_1170 = 0;
        uStack_1168 = 0;
        auVar9 = vfmadd213ps_fma(auVar19,auVar8,ZEXT1632(auVar9));
        local_43e0 = auVar9._0_8_;
        uStack_43d8 = auVar9._8_8_;
        local_3328 = local_3570 + 5;
        local_2260 = *(undefined8 *)*local_3328;
        uStack_2258 = *(undefined8 *)(local_3570[5] + 8);
        uStack_2250 = *(undefined8 *)(local_3570[5] + 0x10);
        uStack_2248 = *(undefined8 *)(local_3570[5] + 0x18);
        auVar23 = *local_3328;
        local_3330 = local_3578 + 5;
        local_2380 = *(undefined8 *)*local_3330;
        uStack_2378 = *(undefined8 *)(local_3578[5] + 8);
        uStack_2370 = *(undefined8 *)(local_3578[5] + 0x10);
        uStack_2368 = *(undefined8 *)(local_3578[5] + 0x18);
        auVar13 = *local_3330;
        local_3338 = local_3580 + 5;
        local_24a0 = *(undefined8 *)*local_3338;
        uStack_2498 = *(undefined8 *)(local_3580[5] + 8);
        uStack_2490 = *(undefined8 *)(local_3580[5] + 0x10);
        uStack_2488 = *(undefined8 *)(local_3580[5] + 0x18);
        auVar15 = *local_3338;
        local_3340 = local_3570 + 6;
        local_2560 = *(undefined8 *)*local_3340;
        uStack_2558 = *(undefined8 *)(local_3570[6] + 8);
        uStack_2550 = *(undefined8 *)(local_3570[6] + 0x10);
        uStack_2548 = *(undefined8 *)(local_3570[6] + 0x18);
        auVar17 = *local_3340;
        auVar11 = *local_3340;
        local_3348 = local_3578 + 6;
        local_2680 = *(undefined8 *)*local_3348;
        uStack_2678 = *(undefined8 *)(local_3578[6] + 8);
        uStack_2670 = *(undefined8 *)(local_3578[6] + 0x10);
        uStack_2668 = *(undefined8 *)(local_3578[6] + 0x18);
        auVar18 = *local_3348;
        auVar14 = *local_3348;
        local_3350 = local_3580 + 6;
        local_27a0 = *(undefined8 *)*local_3350;
        uStack_2798 = *(undefined8 *)(local_3580[6] + 8);
        uStack_2790 = *(undefined8 *)(local_3580[6] + 0x10);
        uStack_2788 = *(undefined8 *)(local_3580[6] + 0x18);
        auVar19 = *local_3350;
        auVar16 = *local_3350;
        local_1988 = local_3520 + 8;
        local_19c0 = local_43e0;
        uStack_19b8 = uStack_43d8;
        uStack_19b0 = 0;
        uStack_19a8 = 0;
        *(undefined8 *)local_1988 = local_43e0;
        *(undefined8 *)(local_3520 + 10) = uStack_43d8;
        local_1950[0xc] = 0.0;
        local_1950[0xd] = 0.0;
        local_1950[0xe] = 0.0;
        local_1950[0xf] = 0.0;
        local_21e0 = local_3ec0;
        uStack_21d8 = uStack_3eb8;
        uStack_21d0 = uStack_3eb0;
        uStack_21c8 = uStack_3ea8;
        local_2220 = local_3500;
        uStack_2218 = uStack_34f8;
        uStack_2210 = uStack_34f0;
        uStack_2208 = uStack_34e8;
        local_10e0 = local_3ec0;
        uStack_10d8 = uStack_3eb8;
        uStack_10d0 = uStack_3eb0;
        uStack_10c8 = uStack_3ea8;
        local_1120 = local_3500;
        uStack_1118 = uStack_34f8;
        uStack_1110 = uStack_34f0;
        uStack_1108 = uStack_34e8;
        auVar12._8_8_ = uStack_34f8;
        auVar12._0_8_ = local_3500;
        auVar12._16_8_ = uStack_34f0;
        auVar12._24_8_ = uStack_34e8;
        auVar9 = vfmadd213ps_fma(auVar20,auVar24,auVar12);
        local_44c0 = auVar9._0_8_;
        uStack_44b8 = auVar9._8_8_;
        local_2240 = local_3ee0;
        uStack_2238 = uStack_3ed8;
        uStack_2230 = uStack_3ed0;
        uStack_2228 = uStack_3ec8;
        local_2280 = local_44c0;
        uStack_2278 = uStack_44b8;
        uStack_2270 = 0;
        uStack_2268 = 0;
        local_1080 = local_3ee0;
        uStack_1078 = uStack_3ed8;
        uStack_1070 = uStack_3ed0;
        uStack_1068 = uStack_3ec8;
        local_10c0 = local_44c0;
        uStack_10b8 = uStack_44b8;
        uStack_10b0 = 0;
        uStack_10a8 = 0;
        auVar9 = vfmadd213ps_fma(auVar23,auVar1,ZEXT1632(auVar9));
        local_44e0 = auVar9._0_8_;
        uStack_44d8 = auVar9._8_8_;
        local_22a0 = local_3f00;
        uStack_2298 = uStack_3ef8;
        uStack_2290 = uStack_3ef0;
        uStack_2288 = uStack_3ee8;
        local_22e0 = local_44e0;
        uStack_22d8 = uStack_44d8;
        uStack_22d0 = 0;
        uStack_22c8 = 0;
        local_1020 = local_3f00;
        uStack_1018 = uStack_3ef8;
        uStack_1010 = uStack_3ef0;
        uStack_1008 = uStack_3ee8;
        local_1060 = local_44e0;
        uStack_1058 = uStack_44d8;
        uStack_1050 = 0;
        uStack_1048 = 0;
        auVar9 = vfmadd213ps_fma(auVar11,auVar2,ZEXT1632(auVar9));
        local_4500 = auVar9._0_8_;
        uStack_44f8 = auVar9._8_8_;
        local_2300 = local_3f20;
        uStack_22f8 = uStack_3f18;
        uStack_22f0 = uStack_3f10;
        uStack_22e8 = uStack_3f08;
        local_2340 = local_4500;
        uStack_2338 = uStack_44f8;
        uStack_2330 = 0;
        uStack_2328 = 0;
        local_fc0 = local_3f20;
        uStack_fb8 = uStack_3f18;
        uStack_fb0 = uStack_3f10;
        uStack_fa8 = uStack_3f08;
        local_1000 = local_4500;
        uStack_ff8 = uStack_44f8;
        uStack_ff0 = 0;
        uStack_fe8 = 0;
        auVar9 = vfmadd213ps_fma(auVar21,auVar3,ZEXT1632(auVar9));
        local_4520 = auVar9._0_8_;
        uStack_4518 = auVar9._8_8_;
        local_2360 = local_3f40;
        uStack_2358 = uStack_3f38;
        uStack_2350 = uStack_3f30;
        uStack_2348 = uStack_3f28;
        local_23a0 = local_4520;
        uStack_2398 = uStack_4518;
        uStack_2390 = 0;
        uStack_2388 = 0;
        local_f60 = local_3f40;
        uStack_f58 = uStack_3f38;
        uStack_f50 = uStack_3f30;
        uStack_f48 = uStack_3f28;
        local_fa0 = local_4520;
        uStack_f98 = uStack_4518;
        uStack_f90 = 0;
        uStack_f88 = 0;
        auVar9 = vfmadd213ps_fma(auVar13,auVar4,ZEXT1632(auVar9));
        local_4540 = auVar9._0_8_;
        uStack_4538 = auVar9._8_8_;
        local_23c0 = local_3f60;
        uStack_23b8 = uStack_3f58;
        uStack_23b0 = uStack_3f50;
        uStack_23a8 = uStack_3f48;
        local_2400 = local_4540;
        uStack_23f8 = uStack_4538;
        uStack_23f0 = 0;
        uStack_23e8 = 0;
        local_f00 = local_3f60;
        uStack_ef8 = uStack_3f58;
        uStack_ef0 = uStack_3f50;
        uStack_ee8 = uStack_3f48;
        local_f40 = local_4540;
        uStack_f38 = uStack_4538;
        uStack_f30 = 0;
        uStack_f28 = 0;
        auVar9 = vfmadd213ps_fma(auVar14,auVar5,ZEXT1632(auVar9));
        local_4560 = auVar9._0_8_;
        uStack_4558 = auVar9._8_8_;
        local_2420 = local_3f80;
        uStack_2418 = uStack_3f78;
        uStack_2410 = uStack_3f70;
        uStack_2408 = uStack_3f68;
        local_2460 = local_4560;
        uStack_2458 = uStack_4558;
        uStack_2450 = 0;
        uStack_2448 = 0;
        local_ea0 = local_3f80;
        uStack_e98 = uStack_3f78;
        uStack_e90 = uStack_3f70;
        uStack_e88 = uStack_3f68;
        local_ee0 = local_4560;
        uStack_ed8 = uStack_4558;
        uStack_ed0 = 0;
        uStack_ec8 = 0;
        auVar9 = vfmadd213ps_fma(auVar22,auVar6,ZEXT1632(auVar9));
        local_4580 = auVar9._0_8_;
        uStack_4578 = auVar9._8_8_;
        local_2480 = local_3fa0;
        uStack_2478 = uStack_3f98;
        uStack_2470 = uStack_3f90;
        uStack_2468 = uStack_3f88;
        local_24c0 = local_4580;
        uStack_24b8 = uStack_4578;
        uStack_24b0 = 0;
        uStack_24a8 = 0;
        local_e40 = local_3fa0;
        uStack_e38 = uStack_3f98;
        uStack_e30 = uStack_3f90;
        uStack_e28 = uStack_3f88;
        local_e80 = local_4580;
        uStack_e78 = uStack_4578;
        uStack_e70 = 0;
        uStack_e68 = 0;
        auVar9 = vfmadd213ps_fma(auVar15,auVar7,ZEXT1632(auVar9));
        local_45a0 = auVar9._0_8_;
        uStack_4598 = auVar9._8_8_;
        local_24e0 = local_3fc0;
        uStack_24d8 = uStack_3fb8;
        uStack_24d0 = uStack_3fb0;
        uStack_24c8 = uStack_3fa8;
        local_2520 = local_45a0;
        uStack_2518 = uStack_4598;
        uStack_2510 = 0;
        uStack_2508 = 0;
        local_de0 = local_3fc0;
        uStack_dd8 = uStack_3fb8;
        uStack_dd0 = uStack_3fb0;
        uStack_dc8 = uStack_3fa8;
        local_e20 = local_45a0;
        uStack_e18 = uStack_4598;
        uStack_e10 = 0;
        uStack_e08 = 0;
        auVar9 = vfmadd213ps_fma(auVar16,auVar8,ZEXT1632(auVar9));
        local_45c0 = auVar9._0_8_;
        uStack_45b8 = auVar9._8_8_;
        local_3358 = local_3570 + 7;
        local_25c0 = *(undefined8 *)*local_3358;
        uStack_25b8 = *(undefined8 *)(local_3570[7] + 8);
        uStack_25b0 = *(undefined8 *)(local_3570[7] + 0x10);
        uStack_25a8 = *(undefined8 *)(local_3570[7] + 0x18);
        auVar23 = *local_3358;
        local_3360 = local_3578 + 7;
        local_26e0 = *(undefined8 *)*local_3360;
        uStack_26d8 = *(undefined8 *)(local_3578[7] + 8);
        uStack_26d0 = *(undefined8 *)(local_3578[7] + 0x10);
        uStack_26c8 = *(undefined8 *)(local_3578[7] + 0x18);
        auVar12 = *local_3360;
        local_3368 = local_3580 + 7;
        local_2800 = *(undefined8 *)*local_3368;
        uStack_27f8 = *(undefined8 *)(local_3580[7] + 8);
        uStack_27f0 = *(undefined8 *)(local_3580[7] + 0x10);
        uStack_27e8 = *(undefined8 *)(local_3580[7] + 0x18);
        auVar15 = *local_3368;
        local_3370 = local_3570 + 8;
        local_2620 = *(undefined8 *)*local_3370;
        uStack_2618 = *(undefined8 *)(local_3570[8] + 8);
        uStack_2610 = *(undefined8 *)(local_3570[8] + 0x10);
        uStack_2608 = *(undefined8 *)(local_3570[8] + 0x18);
        auVar11 = *local_3370;
        local_3378 = local_3578 + 8;
        local_2740 = *(undefined8 *)*local_3378;
        uStack_2738 = *(undefined8 *)(local_3578[8] + 8);
        uStack_2730 = *(undefined8 *)(local_3578[8] + 0x10);
        uStack_2728 = *(undefined8 *)(local_3578[8] + 0x18);
        auVar14 = *local_3378;
        local_3380 = local_3580 + 8;
        local_2860 = *(undefined8 *)*local_3380;
        uStack_2858 = *(undefined8 *)(local_3580[8] + 8);
        uStack_2850 = *(undefined8 *)(local_3580[8] + 0x10);
        uStack_2848 = *(undefined8 *)(local_3580[8] + 0x18);
        auVar16 = *local_3380;
        local_19c8 = local_3520 + 0x10;
        local_1a00 = local_45c0;
        uStack_19f8 = uStack_45b8;
        uStack_19f0 = 0;
        uStack_19e8 = 0;
        *(undefined8 *)local_19c8 = local_45c0;
        *(undefined8 *)(local_3520 + 0x12) = uStack_45b8;
        local_1950[0x14] = 0.0;
        local_1950[0x15] = 0.0;
        local_1950[0x16] = 0.0;
        local_1950[0x17] = 0.0;
        local_2540 = local_3ec0;
        uStack_2538 = uStack_3eb8;
        uStack_2530 = uStack_3eb0;
        uStack_2528 = uStack_3ea8;
        local_2580 = local_3500;
        uStack_2578 = uStack_34f8;
        uStack_2570 = uStack_34f0;
        uStack_2568 = uStack_34e8;
        local_d80 = local_3ec0;
        uStack_d78 = uStack_3eb8;
        uStack_d70 = uStack_3eb0;
        uStack_d68 = uStack_3ea8;
        local_dc0 = local_3500;
        uStack_db8 = uStack_34f8;
        uStack_db0 = uStack_34f0;
        uStack_da8 = uStack_34e8;
        auVar13._8_8_ = uStack_34f8;
        auVar13._0_8_ = local_3500;
        auVar13._16_8_ = uStack_34f0;
        auVar13._24_8_ = uStack_34e8;
        auVar9 = vfmadd213ps_fma(auVar17,auVar24,auVar13);
        local_46a0 = auVar9._0_8_;
        uStack_4698 = auVar9._8_8_;
        local_25a0 = local_3ee0;
        uStack_2598 = uStack_3ed8;
        uStack_2590 = uStack_3ed0;
        uStack_2588 = uStack_3ec8;
        local_25e0 = local_46a0;
        uStack_25d8 = uStack_4698;
        uStack_25d0 = 0;
        uStack_25c8 = 0;
        local_d20 = local_3ee0;
        uStack_d18 = uStack_3ed8;
        uStack_d10 = uStack_3ed0;
        uStack_d08 = uStack_3ec8;
        local_d60 = local_46a0;
        uStack_d58 = uStack_4698;
        uStack_d50 = 0;
        uStack_d48 = 0;
        auVar9 = vfmadd213ps_fma(auVar23,auVar1,ZEXT1632(auVar9));
        local_46c0 = auVar9._0_8_;
        uStack_46b8 = auVar9._8_8_;
        local_2600 = local_3f00;
        uStack_25f8 = uStack_3ef8;
        uStack_25f0 = uStack_3ef0;
        uStack_25e8 = uStack_3ee8;
        local_2640 = local_46c0;
        uStack_2638 = uStack_46b8;
        uStack_2630 = 0;
        uStack_2628 = 0;
        local_cc0 = local_3f00;
        uStack_cb8 = uStack_3ef8;
        uStack_cb0 = uStack_3ef0;
        uStack_ca8 = uStack_3ee8;
        local_d00 = local_46c0;
        uStack_cf8 = uStack_46b8;
        uStack_cf0 = 0;
        uStack_ce8 = 0;
        auVar9 = vfmadd213ps_fma(auVar11,auVar2,ZEXT1632(auVar9));
        local_46e0 = auVar9._0_8_;
        uStack_46d8 = auVar9._8_8_;
        local_2660 = local_3f20;
        uStack_2658 = uStack_3f18;
        uStack_2650 = uStack_3f10;
        uStack_2648 = uStack_3f08;
        local_26a0 = local_46e0;
        uStack_2698 = uStack_46d8;
        uStack_2690 = 0;
        uStack_2688 = 0;
        local_c60 = local_3f20;
        uStack_c58 = uStack_3f18;
        uStack_c50 = uStack_3f10;
        uStack_c48 = uStack_3f08;
        local_ca0 = local_46e0;
        uStack_c98 = uStack_46d8;
        uStack_c90 = 0;
        uStack_c88 = 0;
        auVar9 = vfmadd213ps_fma(auVar18,auVar3,ZEXT1632(auVar9));
        local_4700 = auVar9._0_8_;
        uStack_46f8 = auVar9._8_8_;
        local_26c0 = local_3f40;
        uStack_26b8 = uStack_3f38;
        uStack_26b0 = uStack_3f30;
        uStack_26a8 = uStack_3f28;
        local_2700 = local_4700;
        uStack_26f8 = uStack_46f8;
        uStack_26f0 = 0;
        uStack_26e8 = 0;
        local_c00 = local_3f40;
        uStack_bf8 = uStack_3f38;
        uStack_bf0 = uStack_3f30;
        uStack_be8 = uStack_3f28;
        local_c40 = local_4700;
        uStack_c38 = uStack_46f8;
        uStack_c30 = 0;
        uStack_c28 = 0;
        auVar9 = vfmadd213ps_fma(auVar12,auVar4,ZEXT1632(auVar9));
        local_4720 = auVar9._0_8_;
        uStack_4718 = auVar9._8_8_;
        local_2720 = local_3f60;
        uStack_2718 = uStack_3f58;
        uStack_2710 = uStack_3f50;
        uStack_2708 = uStack_3f48;
        local_2760 = local_4720;
        uStack_2758 = uStack_4718;
        uStack_2750 = 0;
        uStack_2748 = 0;
        local_ba0 = local_3f60;
        uStack_b98 = uStack_3f58;
        uStack_b90 = uStack_3f50;
        uStack_b88 = uStack_3f48;
        local_be0 = local_4720;
        uStack_bd8 = uStack_4718;
        uStack_bd0 = 0;
        uStack_bc8 = 0;
        auVar9 = vfmadd213ps_fma(auVar14,auVar5,ZEXT1632(auVar9));
        local_4740 = auVar9._0_8_;
        uStack_4738 = auVar9._8_8_;
        local_2780 = local_3f80;
        uStack_2778 = uStack_3f78;
        uStack_2770 = uStack_3f70;
        uStack_2768 = uStack_3f68;
        local_27c0 = local_4740;
        uStack_27b8 = uStack_4738;
        uStack_27b0 = 0;
        uStack_27a8 = 0;
        local_b40 = local_3f80;
        uStack_b38 = uStack_3f78;
        uStack_b30 = uStack_3f70;
        uStack_b28 = uStack_3f68;
        local_b80 = local_4740;
        uStack_b78 = uStack_4738;
        uStack_b70 = 0;
        uStack_b68 = 0;
        auVar9 = vfmadd213ps_fma(auVar19,auVar6,ZEXT1632(auVar9));
        local_4760 = auVar9._0_8_;
        uStack_4758 = auVar9._8_8_;
        local_27e0 = local_3fa0;
        uStack_27d8 = uStack_3f98;
        uStack_27d0 = uStack_3f90;
        uStack_27c8 = uStack_3f88;
        local_2820 = local_4760;
        uStack_2818 = uStack_4758;
        uStack_2810 = 0;
        uStack_2808 = 0;
        local_ae0 = local_3fa0;
        uStack_ad8 = uStack_3f98;
        uStack_ad0 = uStack_3f90;
        uStack_ac8 = uStack_3f88;
        local_b20 = local_4760;
        uStack_b18 = uStack_4758;
        uStack_b10 = 0;
        uStack_b08 = 0;
        auVar9 = vfmadd213ps_fma(auVar15,auVar7,ZEXT1632(auVar9));
        local_4780 = auVar9._0_8_;
        uStack_4778 = auVar9._8_8_;
        local_2840 = local_3fc0;
        uStack_2838 = uStack_3fb8;
        uStack_2830 = uStack_3fb0;
        uStack_2828 = uStack_3fa8;
        local_2880 = local_4780;
        uStack_2878 = uStack_4778;
        uStack_2870 = 0;
        uStack_2868 = 0;
        local_a80 = local_3fc0;
        uStack_a78 = uStack_3fb8;
        uStack_a70 = uStack_3fb0;
        uStack_a68 = uStack_3fa8;
        local_ac0 = local_4780;
        uStack_ab8 = uStack_4778;
        uStack_ab0 = 0;
        uStack_aa8 = 0;
        auVar9 = vfmadd213ps_fma(auVar16,auVar8,ZEXT1632(auVar9));
        local_47a0 = auVar9._0_8_;
        uStack_4798 = auVar9._8_8_;
        local_1a08 = local_3520 + 0x18;
        local_1a40 = local_47a0;
        uStack_1a38 = uStack_4798;
        uStack_1a30 = 0;
        uStack_1a28 = 0;
        *(undefined8 *)local_1a08 = local_47a0;
        *(undefined8 *)(local_3520 + 0x1a) = uStack_4798;
        local_1950[0x1c] = 0.0;
        local_1950[0x1d] = 0.0;
        local_1950[0x1e] = 0.0;
        local_1950[0x1f] = 0.0;
        local_3570 = local_3570 + 8;
        local_3578 = local_3578 + 8;
        local_3580 = local_3580 + 8;
        local_3520 = local_3520 + 0x20;
        local_2500 = local_27a0;
        uStack_24f8 = uStack_2798;
        uStack_24f0 = uStack_2790;
        uStack_24e8 = uStack_2788;
        local_23e0 = local_2680;
        uStack_23d8 = uStack_2678;
        uStack_23d0 = uStack_2670;
        uStack_23c8 = uStack_2668;
        local_22c0 = local_2560;
        uStack_22b8 = uStack_2558;
        uStack_22b0 = uStack_2550;
        uStack_22a8 = uStack_2548;
        local_21a0 = local_2440;
        uStack_2198 = uStack_2438;
        uStack_2190 = uStack_2430;
        uStack_2188 = uStack_2428;
        local_2080 = local_2320;
        uStack_2078 = uStack_2318;
        uStack_2070 = uStack_2310;
        uStack_2068 = uStack_2308;
        local_1f60 = local_2200;
        uStack_1f58 = uStack_21f8;
        uStack_1f50 = uStack_21f0;
        uStack_1f48 = uStack_21e8;
        local_1e40 = local_20e0;
        uStack_1e38 = uStack_20d8;
        uStack_1e30 = uStack_20d0;
        uStack_1e28 = uStack_20c8;
        local_1d20 = local_1fc0;
        uStack_1d18 = uStack_1fb8;
        uStack_1d10 = uStack_1fb0;
        uStack_1d08 = uStack_1fa8;
        local_1c00 = local_1ea0;
        uStack_1bf8 = uStack_1e98;
        uStack_1bf0 = uStack_1e90;
        uStack_1be8 = uStack_1e88;
        local_17c0 = local_1b40;
        uStack_17b8 = uStack_1b38;
        uStack_17b0 = uStack_1b30;
        uStack_17a8 = uStack_1b28;
        local_1760 = local_1ba0;
        uStack_1758 = uStack_1b98;
        uStack_1750 = uStack_1b90;
        uStack_1748 = uStack_1b88;
        local_1700 = local_1ea0;
        uStack_16f8 = uStack_1e98;
        uStack_16f0 = uStack_1e90;
        uStack_16e8 = uStack_1e88;
        local_16a0 = local_1c60;
        uStack_1698 = uStack_1c58;
        uStack_1690 = uStack_1c50;
        uStack_1688 = uStack_1c48;
        local_1640 = local_1cc0;
        uStack_1638 = uStack_1cb8;
        uStack_1630 = uStack_1cb0;
        uStack_1628 = uStack_1ca8;
        local_15e0 = local_1fc0;
        uStack_15d8 = uStack_1fb8;
        uStack_15d0 = uStack_1fb0;
        uStack_15c8 = uStack_1fa8;
        local_1580 = local_1d80;
        uStack_1578 = uStack_1d78;
        uStack_1570 = uStack_1d70;
        uStack_1568 = uStack_1d68;
        local_1520 = local_1de0;
        uStack_1518 = uStack_1dd8;
        uStack_1510 = uStack_1dd0;
        uStack_1508 = uStack_1dc8;
        local_14c0 = local_20e0;
        uStack_14b8 = uStack_20d8;
        uStack_14b0 = uStack_20d0;
        uStack_14a8 = uStack_20c8;
        local_1460 = local_1ea0;
        uStack_1458 = uStack_1e98;
        uStack_1450 = uStack_1e90;
        uStack_1448 = uStack_1e88;
        local_1400 = local_1f00;
        uStack_13f8 = uStack_1ef8;
        uStack_13f0 = uStack_1ef0;
        uStack_13e8 = uStack_1ee8;
        local_13a0 = local_2200;
        uStack_1398 = uStack_21f8;
        uStack_1390 = uStack_21f0;
        uStack_1388 = uStack_21e8;
        local_1340 = local_1fc0;
        uStack_1338 = uStack_1fb8;
        uStack_1330 = uStack_1fb0;
        uStack_1328 = uStack_1fa8;
        local_12e0 = local_2020;
        uStack_12d8 = uStack_2018;
        uStack_12d0 = uStack_2010;
        uStack_12c8 = uStack_2008;
        local_1280 = local_2320;
        uStack_1278 = uStack_2318;
        uStack_1270 = uStack_2310;
        uStack_1268 = uStack_2308;
        local_1220 = local_20e0;
        uStack_1218 = uStack_20d8;
        uStack_1210 = uStack_20d0;
        uStack_1208 = uStack_20c8;
        local_11c0 = local_2140;
        uStack_11b8 = uStack_2138;
        uStack_11b0 = uStack_2130;
        uStack_11a8 = uStack_2128;
        local_1160 = local_2440;
        uStack_1158 = uStack_2438;
        uStack_1150 = uStack_2430;
        uStack_1148 = uStack_2428;
        local_1100 = local_2200;
        uStack_10f8 = uStack_21f8;
        uStack_10f0 = uStack_21f0;
        uStack_10e8 = uStack_21e8;
        local_10a0 = local_2260;
        uStack_1098 = uStack_2258;
        uStack_1090 = uStack_2250;
        uStack_1088 = uStack_2248;
        local_1040 = local_2560;
        uStack_1038 = uStack_2558;
        uStack_1030 = uStack_2550;
        uStack_1028 = uStack_2548;
        local_fe0 = local_2320;
        uStack_fd8 = uStack_2318;
        uStack_fd0 = uStack_2310;
        uStack_fc8 = uStack_2308;
        local_f80 = local_2380;
        uStack_f78 = uStack_2378;
        uStack_f70 = uStack_2370;
        uStack_f68 = uStack_2368;
        local_f20 = local_2680;
        uStack_f18 = uStack_2678;
        uStack_f10 = uStack_2670;
        uStack_f08 = uStack_2668;
        local_ec0 = local_2440;
        uStack_eb8 = uStack_2438;
        uStack_eb0 = uStack_2430;
        uStack_ea8 = uStack_2428;
        local_e60 = local_24a0;
        uStack_e58 = uStack_2498;
        uStack_e50 = uStack_2490;
        uStack_e48 = uStack_2488;
        local_e00 = local_27a0;
        uStack_df8 = uStack_2798;
        uStack_df0 = uStack_2790;
        uStack_de8 = uStack_2788;
        local_da0 = local_2560;
        uStack_d98 = uStack_2558;
        uStack_d90 = uStack_2550;
        uStack_d88 = uStack_2548;
        local_d40 = local_25c0;
        uStack_d38 = uStack_25b8;
        uStack_d30 = uStack_25b0;
        uStack_d28 = uStack_25a8;
        local_ce0 = local_2620;
        uStack_cd8 = uStack_2618;
        uStack_cd0 = uStack_2610;
        uStack_cc8 = uStack_2608;
        local_c80 = local_2680;
        uStack_c78 = uStack_2678;
        uStack_c70 = uStack_2670;
        uStack_c68 = uStack_2668;
        local_c20 = local_26e0;
        uStack_c18 = uStack_26d8;
        uStack_c10 = uStack_26d0;
        uStack_c08 = uStack_26c8;
        local_bc0 = local_2740;
        uStack_bb8 = uStack_2738;
        uStack_bb0 = uStack_2730;
        uStack_ba8 = uStack_2728;
        local_b60 = local_27a0;
        uStack_b58 = uStack_2798;
        uStack_b50 = uStack_2790;
        uStack_b48 = uStack_2788;
        local_b00 = local_2800;
        uStack_af8 = uStack_27f8;
        uStack_af0 = uStack_27f0;
        uStack_ae8 = uStack_27e8;
        local_aa0 = local_2860;
        uStack_a98 = uStack_2858;
        uStack_a90 = uStack_2850;
        uStack_a88 = uStack_2848;
      }
      for (; auVar23 = _local_4de0, local_36a8 + 1 < local_3478; local_36a8 = local_36a8 + 2) {
        local_3388 = local_3570;
        local_28c0 = *(undefined8 *)*local_3570;
        uStack_28b8 = *(undefined8 *)(*local_3570 + 8);
        uStack_28b0 = *(undefined8 *)(*local_3570 + 0x10);
        uStack_28a8 = *(undefined8 *)(*local_3570 + 0x18);
        local_3390 = local_3570 + 1;
        local_2920 = *(undefined8 *)*local_3390;
        uStack_2918 = *(undefined8 *)(local_3570[1] + 8);
        uStack_2910 = *(undefined8 *)(local_3570[1] + 0x10);
        uStack_2908 = *(undefined8 *)(local_3570[1] + 0x18);
        local_3398 = local_3570 + 2;
        local_2c20 = *(undefined8 *)*local_3398;
        uStack_2c18 = *(undefined8 *)(local_3570[2] + 8);
        uStack_2c10 = *(undefined8 *)(local_3570[2] + 0x10);
        uStack_2c08 = *(undefined8 *)(local_3570[2] + 0x18);
        auVar23 = *local_3398;
        local_33a0 = local_3578;
        local_29e0 = *(undefined8 *)*local_3578;
        uStack_29d8 = *(undefined8 *)(*local_3578 + 8);
        uStack_29d0 = *(undefined8 *)(*local_3578 + 0x10);
        uStack_29c8 = *(undefined8 *)(*local_3578 + 0x18);
        local_33a8 = local_3578 + 1;
        local_2a40 = *(undefined8 *)*local_33a8;
        uStack_2a38 = *(undefined8 *)(local_3578[1] + 8);
        uStack_2a30 = *(undefined8 *)(local_3578[1] + 0x10);
        uStack_2a28 = *(undefined8 *)(local_3578[1] + 0x18);
        local_33b0 = local_3578 + 2;
        local_2d40 = *(undefined8 *)*local_33b0;
        uStack_2d38 = *(undefined8 *)(local_3578[2] + 8);
        uStack_2d30 = *(undefined8 *)(local_3578[2] + 0x10);
        uStack_2d28 = *(undefined8 *)(local_3578[2] + 0x18);
        auVar13 = *local_33b0;
        local_33b8 = local_3580;
        local_2b00 = *(undefined8 *)*local_3580;
        uStack_2af8 = *(undefined8 *)(*local_3580 + 8);
        uStack_2af0 = *(undefined8 *)(*local_3580 + 0x10);
        uStack_2ae8 = *(undefined8 *)(*local_3580 + 0x18);
        local_33c0 = local_3580 + 1;
        local_2b60 = *(undefined8 *)*local_33c0;
        uStack_2b58 = *(undefined8 *)(local_3580[1] + 8);
        uStack_2b50 = *(undefined8 *)(local_3580[1] + 0x10);
        uStack_2b48 = *(undefined8 *)(local_3580[1] + 0x18);
        local_33c8 = local_3580 + 2;
        local_2e60 = *(undefined8 *)*local_33c8;
        uStack_2e58 = *(undefined8 *)(local_3580[2] + 8);
        uStack_2e50 = *(undefined8 *)(local_3580[2] + 0x10);
        uStack_2e48 = *(undefined8 *)(local_3580[2] + 0x18);
        auVar17 = *local_33c8;
        local_28a0 = local_3ec0;
        uStack_2898 = uStack_3eb8;
        uStack_2890 = uStack_3eb0;
        uStack_2888 = uStack_3ea8;
        local_28e0 = local_3500;
        uStack_28d8 = uStack_34f8;
        uStack_28d0 = uStack_34f0;
        uStack_28c8 = uStack_34e8;
        local_a20 = local_3ec0;
        uStack_a18 = uStack_3eb8;
        uStack_a10 = uStack_3eb0;
        uStack_a08 = uStack_3ea8;
        local_a60 = local_3500;
        uStack_a58 = uStack_34f8;
        uStack_a50 = uStack_34f0;
        uStack_a48 = uStack_34e8;
        auVar14._8_8_ = uStack_34f8;
        auVar14._0_8_ = local_3500;
        auVar14._16_8_ = uStack_34f0;
        auVar14._24_8_ = uStack_34e8;
        auVar9 = vfmadd213ps_fma(*local_3570,auVar24,auVar14);
        local_48e0 = auVar9._0_8_;
        uStack_48d8 = auVar9._8_8_;
        local_2900 = local_3ee0;
        uStack_28f8 = uStack_3ed8;
        uStack_28f0 = uStack_3ed0;
        uStack_28e8 = uStack_3ec8;
        local_2940 = local_48e0;
        uStack_2938 = uStack_48d8;
        uStack_2930 = 0;
        uStack_2928 = 0;
        local_9c0 = local_3ee0;
        uStack_9b8 = uStack_3ed8;
        uStack_9b0 = uStack_3ed0;
        uStack_9a8 = uStack_3ec8;
        local_a00 = local_48e0;
        uStack_9f8 = uStack_48d8;
        uStack_9f0 = 0;
        uStack_9e8 = 0;
        auVar9 = vfmadd213ps_fma(*local_3390,auVar1,ZEXT1632(auVar9));
        local_4900 = auVar9._0_8_;
        uStack_48f8 = auVar9._8_8_;
        local_2960 = local_3f00;
        uStack_2958 = uStack_3ef8;
        uStack_2950 = uStack_3ef0;
        uStack_2948 = uStack_3ee8;
        local_29a0 = local_4900;
        uStack_2998 = uStack_48f8;
        uStack_2990 = 0;
        uStack_2988 = 0;
        local_960 = local_3f00;
        uStack_958 = uStack_3ef8;
        uStack_950 = uStack_3ef0;
        uStack_948 = uStack_3ee8;
        local_9a0 = local_4900;
        uStack_998 = uStack_48f8;
        uStack_990 = 0;
        uStack_988 = 0;
        auVar9 = vfmadd213ps_fma(*local_3398,auVar2,ZEXT1632(auVar9));
        local_4920 = auVar9._0_8_;
        uStack_4918 = auVar9._8_8_;
        local_29c0 = local_3f20;
        uStack_29b8 = uStack_3f18;
        uStack_29b0 = uStack_3f10;
        uStack_29a8 = uStack_3f08;
        local_2a00 = local_4920;
        uStack_29f8 = uStack_4918;
        uStack_29f0 = 0;
        uStack_29e8 = 0;
        local_900 = local_3f20;
        uStack_8f8 = uStack_3f18;
        uStack_8f0 = uStack_3f10;
        uStack_8e8 = uStack_3f08;
        local_940 = local_4920;
        uStack_938 = uStack_4918;
        uStack_930 = 0;
        uStack_928 = 0;
        auVar9 = vfmadd213ps_fma(*local_3578,auVar3,ZEXT1632(auVar9));
        local_4940 = auVar9._0_8_;
        uStack_4938 = auVar9._8_8_;
        local_2a20 = local_3f40;
        uStack_2a18 = uStack_3f38;
        uStack_2a10 = uStack_3f30;
        uStack_2a08 = uStack_3f28;
        local_2a60 = local_4940;
        uStack_2a58 = uStack_4938;
        uStack_2a50 = 0;
        uStack_2a48 = 0;
        local_8a0 = local_3f40;
        uStack_898 = uStack_3f38;
        uStack_890 = uStack_3f30;
        uStack_888 = uStack_3f28;
        local_8e0 = local_4940;
        uStack_8d8 = uStack_4938;
        uStack_8d0 = 0;
        uStack_8c8 = 0;
        auVar9 = vfmadd213ps_fma(*local_33a8,auVar4,ZEXT1632(auVar9));
        local_4960 = auVar9._0_8_;
        uStack_4958 = auVar9._8_8_;
        local_2a80 = local_3f60;
        uStack_2a78 = uStack_3f58;
        uStack_2a70 = uStack_3f50;
        uStack_2a68 = uStack_3f48;
        local_2ac0 = local_4960;
        uStack_2ab8 = uStack_4958;
        uStack_2ab0 = 0;
        uStack_2aa8 = 0;
        local_840 = local_3f60;
        uStack_838 = uStack_3f58;
        uStack_830 = uStack_3f50;
        uStack_828 = uStack_3f48;
        local_880 = local_4960;
        uStack_878 = uStack_4958;
        uStack_870 = 0;
        uStack_868 = 0;
        auVar9 = vfmadd213ps_fma(*local_33b0,auVar5,ZEXT1632(auVar9));
        local_4980 = auVar9._0_8_;
        uStack_4978 = auVar9._8_8_;
        local_2ae0 = local_3f80;
        uStack_2ad8 = uStack_3f78;
        uStack_2ad0 = uStack_3f70;
        uStack_2ac8 = uStack_3f68;
        local_2b20 = local_4980;
        uStack_2b18 = uStack_4978;
        uStack_2b10 = 0;
        uStack_2b08 = 0;
        local_7e0 = local_3f80;
        uStack_7d8 = uStack_3f78;
        uStack_7d0 = uStack_3f70;
        uStack_7c8 = uStack_3f68;
        local_820 = local_4980;
        uStack_818 = uStack_4978;
        uStack_810 = 0;
        uStack_808 = 0;
        auVar9 = vfmadd213ps_fma(*local_3580,auVar6,ZEXT1632(auVar9));
        local_49a0 = auVar9._0_8_;
        uStack_4998 = auVar9._8_8_;
        local_2b40 = local_3fa0;
        uStack_2b38 = uStack_3f98;
        uStack_2b30 = uStack_3f90;
        uStack_2b28 = uStack_3f88;
        local_2b80 = local_49a0;
        uStack_2b78 = uStack_4998;
        uStack_2b70 = 0;
        uStack_2b68 = 0;
        local_780 = local_3fa0;
        uStack_778 = uStack_3f98;
        uStack_770 = uStack_3f90;
        uStack_768 = uStack_3f88;
        local_7c0 = local_49a0;
        uStack_7b8 = uStack_4998;
        uStack_7b0 = 0;
        uStack_7a8 = 0;
        auVar9 = vfmadd213ps_fma(*local_33c0,auVar7,ZEXT1632(auVar9));
        local_49c0 = auVar9._0_8_;
        uStack_49b8 = auVar9._8_8_;
        local_2ba0 = local_3fc0;
        uStack_2b98 = uStack_3fb8;
        uStack_2b90 = uStack_3fb0;
        uStack_2b88 = uStack_3fa8;
        local_2be0 = local_49c0;
        uStack_2bd8 = uStack_49b8;
        uStack_2bd0 = 0;
        uStack_2bc8 = 0;
        local_720 = local_3fc0;
        uStack_718 = uStack_3fb8;
        uStack_710 = uStack_3fb0;
        uStack_708 = uStack_3fa8;
        local_760 = local_49c0;
        uStack_758 = uStack_49b8;
        uStack_750 = 0;
        uStack_748 = 0;
        auVar9 = vfmadd213ps_fma(*local_33c8,auVar8,ZEXT1632(auVar9));
        local_49e0 = auVar9._0_8_;
        uStack_49d8 = auVar9._8_8_;
        local_33d0 = local_3570 + 3;
        local_2c80 = *(undefined8 *)*local_33d0;
        uStack_2c78 = *(undefined8 *)(local_3570[3] + 8);
        uStack_2c70 = *(undefined8 *)(local_3570[3] + 0x10);
        uStack_2c68 = *(undefined8 *)(local_3570[3] + 0x18);
        auVar11 = *local_33d0;
        local_33d8 = local_3578 + 3;
        local_2da0 = *(undefined8 *)*local_33d8;
        uStack_2d98 = *(undefined8 *)(local_3578[3] + 8);
        uStack_2d90 = *(undefined8 *)(local_3578[3] + 0x10);
        uStack_2d88 = *(undefined8 *)(local_3578[3] + 0x18);
        auVar14 = *local_33d8;
        local_33e0 = local_3580 + 3;
        local_2ec0 = *(undefined8 *)*local_33e0;
        uStack_2eb8 = *(undefined8 *)(local_3580[3] + 8);
        uStack_2eb0 = *(undefined8 *)(local_3580[3] + 0x10);
        uStack_2ea8 = *(undefined8 *)(local_3580[3] + 0x18);
        auVar18 = *local_33e0;
        local_33e8 = local_3570 + 4;
        local_2ce0 = *(undefined8 *)*local_33e8;
        uStack_2cd8 = *(undefined8 *)(local_3570[4] + 8);
        uStack_2cd0 = *(undefined8 *)(local_3570[4] + 0x10);
        uStack_2cc8 = *(undefined8 *)(local_3570[4] + 0x18);
        auVar12 = *local_33e8;
        local_33f0 = local_3578 + 4;
        local_2e00 = *(undefined8 *)*local_33f0;
        uStack_2df8 = *(undefined8 *)(local_3578[4] + 8);
        uStack_2df0 = *(undefined8 *)(local_3578[4] + 0x10);
        uStack_2de8 = *(undefined8 *)(local_3578[4] + 0x18);
        auVar16 = *local_33f0;
        local_33f8 = local_3580 + 4;
        local_2f20 = *(undefined8 *)*local_33f8;
        uStack_2f18 = *(undefined8 *)(local_3580[4] + 8);
        uStack_2f10 = *(undefined8 *)(local_3580[4] + 0x10);
        uStack_2f08 = *(undefined8 *)(local_3580[4] + 0x18);
        auVar19 = *local_33f8;
        local_1a48 = local_3520;
        local_1a80 = local_49e0;
        uStack_1a78 = uStack_49d8;
        uStack_1a70 = 0;
        uStack_1a68 = 0;
        *(undefined8 *)local_3520 = local_49e0;
        *(undefined8 *)(local_3520 + 2) = uStack_49d8;
        local_1a48[4] = 0.0;
        local_1a48[5] = 0.0;
        local_1a48[6] = 0.0;
        local_1a48[7] = 0.0;
        local_2c00 = local_3ec0;
        uStack_2bf8 = uStack_3eb8;
        uStack_2bf0 = uStack_3eb0;
        uStack_2be8 = uStack_3ea8;
        local_2c40 = local_3500;
        uStack_2c38 = uStack_34f8;
        uStack_2c30 = uStack_34f0;
        uStack_2c28 = uStack_34e8;
        local_6c0 = local_3ec0;
        uStack_6b8 = uStack_3eb8;
        uStack_6b0 = uStack_3eb0;
        uStack_6a8 = uStack_3ea8;
        local_700 = local_3500;
        uStack_6f8 = uStack_34f8;
        uStack_6f0 = uStack_34f0;
        uStack_6e8 = uStack_34e8;
        auVar15._8_8_ = uStack_34f8;
        auVar15._0_8_ = local_3500;
        auVar15._16_8_ = uStack_34f0;
        auVar15._24_8_ = uStack_34e8;
        auVar9 = vfmadd213ps_fma(auVar23,auVar24,auVar15);
        local_4ac0 = auVar9._0_8_;
        uStack_4ab8 = auVar9._8_8_;
        local_2c60 = local_3ee0;
        uStack_2c58 = uStack_3ed8;
        uStack_2c50 = uStack_3ed0;
        uStack_2c48 = uStack_3ec8;
        local_2ca0 = local_4ac0;
        uStack_2c98 = uStack_4ab8;
        uStack_2c90 = 0;
        uStack_2c88 = 0;
        local_660 = local_3ee0;
        uStack_658 = uStack_3ed8;
        uStack_650 = uStack_3ed0;
        uStack_648 = uStack_3ec8;
        local_6a0 = local_4ac0;
        uStack_698 = uStack_4ab8;
        uStack_690 = 0;
        uStack_688 = 0;
        auVar9 = vfmadd213ps_fma(auVar11,auVar1,ZEXT1632(auVar9));
        local_4ae0 = auVar9._0_8_;
        uStack_4ad8 = auVar9._8_8_;
        local_2cc0 = local_3f00;
        uStack_2cb8 = uStack_3ef8;
        uStack_2cb0 = uStack_3ef0;
        uStack_2ca8 = uStack_3ee8;
        local_2d00 = local_4ae0;
        uStack_2cf8 = uStack_4ad8;
        uStack_2cf0 = 0;
        uStack_2ce8 = 0;
        local_600 = local_3f00;
        uStack_5f8 = uStack_3ef8;
        uStack_5f0 = uStack_3ef0;
        uStack_5e8 = uStack_3ee8;
        local_640 = local_4ae0;
        uStack_638 = uStack_4ad8;
        uStack_630 = 0;
        uStack_628 = 0;
        auVar9 = vfmadd213ps_fma(auVar12,auVar2,ZEXT1632(auVar9));
        local_4b00 = auVar9._0_8_;
        uStack_4af8 = auVar9._8_8_;
        local_2d20 = local_3f20;
        uStack_2d18 = uStack_3f18;
        uStack_2d10 = uStack_3f10;
        uStack_2d08 = uStack_3f08;
        local_2d60 = local_4b00;
        uStack_2d58 = uStack_4af8;
        uStack_2d50 = 0;
        uStack_2d48 = 0;
        local_5a0 = local_3f20;
        uStack_598 = uStack_3f18;
        uStack_590 = uStack_3f10;
        uStack_588 = uStack_3f08;
        local_5e0 = local_4b00;
        uStack_5d8 = uStack_4af8;
        uStack_5d0 = 0;
        uStack_5c8 = 0;
        auVar9 = vfmadd213ps_fma(auVar13,auVar3,ZEXT1632(auVar9));
        local_4b20 = auVar9._0_8_;
        uStack_4b18 = auVar9._8_8_;
        local_2d80 = local_3f40;
        uStack_2d78 = uStack_3f38;
        uStack_2d70 = uStack_3f30;
        uStack_2d68 = uStack_3f28;
        local_2dc0 = local_4b20;
        uStack_2db8 = uStack_4b18;
        uStack_2db0 = 0;
        uStack_2da8 = 0;
        local_540 = local_3f40;
        uStack_538 = uStack_3f38;
        uStack_530 = uStack_3f30;
        uStack_528 = uStack_3f28;
        local_580 = local_4b20;
        uStack_578 = uStack_4b18;
        uStack_570 = 0;
        uStack_568 = 0;
        auVar9 = vfmadd213ps_fma(auVar14,auVar4,ZEXT1632(auVar9));
        local_4b40 = auVar9._0_8_;
        uStack_4b38 = auVar9._8_8_;
        local_2de0 = local_3f60;
        uStack_2dd8 = uStack_3f58;
        uStack_2dd0 = uStack_3f50;
        uStack_2dc8 = uStack_3f48;
        local_2e20 = local_4b40;
        uStack_2e18 = uStack_4b38;
        uStack_2e10 = 0;
        uStack_2e08 = 0;
        local_4e0 = local_3f60;
        uStack_4d8 = uStack_3f58;
        uStack_4d0 = uStack_3f50;
        uStack_4c8 = uStack_3f48;
        local_520 = local_4b40;
        uStack_518 = uStack_4b38;
        uStack_510 = 0;
        uStack_508 = 0;
        auVar9 = vfmadd213ps_fma(auVar16,auVar5,ZEXT1632(auVar9));
        local_4b60 = auVar9._0_8_;
        uStack_4b58 = auVar9._8_8_;
        local_2e40 = local_3f80;
        uStack_2e38 = uStack_3f78;
        uStack_2e30 = uStack_3f70;
        uStack_2e28 = uStack_3f68;
        local_2e80 = local_4b60;
        uStack_2e78 = uStack_4b58;
        uStack_2e70 = 0;
        uStack_2e68 = 0;
        local_480 = local_3f80;
        uStack_478 = uStack_3f78;
        uStack_470 = uStack_3f70;
        uStack_468 = uStack_3f68;
        local_4c0 = local_4b60;
        uStack_4b8 = uStack_4b58;
        uStack_4b0 = 0;
        uStack_4a8 = 0;
        auVar9 = vfmadd213ps_fma(auVar17,auVar6,ZEXT1632(auVar9));
        local_4b80 = auVar9._0_8_;
        uStack_4b78 = auVar9._8_8_;
        local_2ea0 = local_3fa0;
        uStack_2e98 = uStack_3f98;
        uStack_2e90 = uStack_3f90;
        uStack_2e88 = uStack_3f88;
        local_2ee0 = local_4b80;
        uStack_2ed8 = uStack_4b78;
        uStack_2ed0 = 0;
        uStack_2ec8 = 0;
        local_420 = local_3fa0;
        uStack_418 = uStack_3f98;
        uStack_410 = uStack_3f90;
        uStack_408 = uStack_3f88;
        local_460 = local_4b80;
        uStack_458 = uStack_4b78;
        uStack_450 = 0;
        uStack_448 = 0;
        auVar9 = vfmadd213ps_fma(auVar18,auVar7,ZEXT1632(auVar9));
        local_4ba0 = auVar9._0_8_;
        uStack_4b98 = auVar9._8_8_;
        local_2f00 = local_3fc0;
        uStack_2ef8 = uStack_3fb8;
        uStack_2ef0 = uStack_3fb0;
        uStack_2ee8 = uStack_3fa8;
        local_2f40 = local_4ba0;
        uStack_2f38 = uStack_4b98;
        uStack_2f30 = 0;
        uStack_2f28 = 0;
        local_3c0 = local_3fc0;
        uStack_3b8 = uStack_3fb8;
        uStack_3b0 = uStack_3fb0;
        uStack_3a8 = uStack_3fa8;
        local_400 = local_4ba0;
        uStack_3f8 = uStack_4b98;
        uStack_3f0 = 0;
        uStack_3e8 = 0;
        auVar9 = vfmadd213ps_fma(auVar19,auVar8,ZEXT1632(auVar9));
        local_4bc0 = auVar9._0_8_;
        uStack_4bb8 = auVar9._8_8_;
        local_1a88 = local_3520 + 8;
        local_1ac0 = local_4bc0;
        uStack_1ab8 = uStack_4bb8;
        uStack_1ab0 = 0;
        uStack_1aa8 = 0;
        *(undefined8 *)local_1a88 = local_4bc0;
        *(undefined8 *)(local_3520 + 10) = uStack_4bb8;
        local_1a48[0xc] = 0.0;
        local_1a48[0xd] = 0.0;
        local_1a48[0xe] = 0.0;
        local_1a48[0xf] = 0.0;
        local_3570 = local_3570 + 4;
        local_3578 = local_3578 + 4;
        local_3580 = local_3580 + 4;
        local_3520 = local_3520 + 0x10;
        local_2bc0 = local_2e60;
        uStack_2bb8 = uStack_2e58;
        uStack_2bb0 = uStack_2e50;
        uStack_2ba8 = uStack_2e48;
        local_2aa0 = local_2d40;
        uStack_2a98 = uStack_2d38;
        uStack_2a90 = uStack_2d30;
        uStack_2a88 = uStack_2d28;
        local_2980 = local_2c20;
        uStack_2978 = uStack_2c18;
        uStack_2970 = uStack_2c10;
        uStack_2968 = uStack_2c08;
        local_a40 = local_28c0;
        uStack_a38 = uStack_28b8;
        uStack_a30 = uStack_28b0;
        uStack_a28 = uStack_28a8;
        local_9e0 = local_2920;
        uStack_9d8 = uStack_2918;
        uStack_9d0 = uStack_2910;
        uStack_9c8 = uStack_2908;
        local_980 = local_2c20;
        uStack_978 = uStack_2c18;
        uStack_970 = uStack_2c10;
        uStack_968 = uStack_2c08;
        local_920 = local_29e0;
        uStack_918 = uStack_29d8;
        uStack_910 = uStack_29d0;
        uStack_908 = uStack_29c8;
        local_8c0 = local_2a40;
        uStack_8b8 = uStack_2a38;
        uStack_8b0 = uStack_2a30;
        uStack_8a8 = uStack_2a28;
        local_860 = local_2d40;
        uStack_858 = uStack_2d38;
        uStack_850 = uStack_2d30;
        uStack_848 = uStack_2d28;
        local_800 = local_2b00;
        uStack_7f8 = uStack_2af8;
        uStack_7f0 = uStack_2af0;
        uStack_7e8 = uStack_2ae8;
        local_7a0 = local_2b60;
        uStack_798 = uStack_2b58;
        uStack_790 = uStack_2b50;
        uStack_788 = uStack_2b48;
        local_740 = local_2e60;
        uStack_738 = uStack_2e58;
        uStack_730 = uStack_2e50;
        uStack_728 = uStack_2e48;
        local_6e0 = local_2c20;
        uStack_6d8 = uStack_2c18;
        uStack_6d0 = uStack_2c10;
        uStack_6c8 = uStack_2c08;
        local_680 = local_2c80;
        uStack_678 = uStack_2c78;
        uStack_670 = uStack_2c70;
        uStack_668 = uStack_2c68;
        local_620 = local_2ce0;
        uStack_618 = uStack_2cd8;
        uStack_610 = uStack_2cd0;
        uStack_608 = uStack_2cc8;
        local_5c0 = local_2d40;
        uStack_5b8 = uStack_2d38;
        uStack_5b0 = uStack_2d30;
        uStack_5a8 = uStack_2d28;
        local_560 = local_2da0;
        uStack_558 = uStack_2d98;
        uStack_550 = uStack_2d90;
        uStack_548 = uStack_2d88;
        local_500 = local_2e00;
        uStack_4f8 = uStack_2df8;
        uStack_4f0 = uStack_2df0;
        uStack_4e8 = uStack_2de8;
        local_4a0 = local_2e60;
        uStack_498 = uStack_2e58;
        uStack_490 = uStack_2e50;
        uStack_488 = uStack_2e48;
        local_440 = local_2ec0;
        uStack_438 = uStack_2eb8;
        uStack_430 = uStack_2eb0;
        uStack_428 = uStack_2ea8;
        local_3e0 = local_2f20;
        uStack_3d8 = uStack_2f18;
        uStack_3d0 = uStack_2f10;
        uStack_3c8 = uStack_2f08;
      }
      for (; _local_4de0 = auVar23, local_36a8 < local_3478; local_36a8 = local_36a8 + 1) {
        local_3400 = local_3570;
        local_2f80 = *(undefined8 *)*local_3570;
        uStack_2f78 = *(undefined8 *)(*local_3570 + 8);
        uStack_2f70 = *(undefined8 *)(*local_3570 + 0x10);
        uStack_2f68 = *(undefined8 *)(*local_3570 + 0x18);
        local_3408 = local_3570 + 1;
        local_2fe0 = *(undefined8 *)*local_3408;
        uStack_2fd8 = *(undefined8 *)(local_3570[1] + 8);
        uStack_2fd0 = *(undefined8 *)(local_3570[1] + 0x10);
        uStack_2fc8 = *(undefined8 *)(local_3570[1] + 0x18);
        local_3410 = local_3570 + 2;
        local_3040 = *(undefined8 *)*local_3410;
        uStack_3038 = *(undefined8 *)(local_3570[2] + 8);
        uStack_3030 = *(undefined8 *)(local_3570[2] + 0x10);
        uStack_3028 = *(undefined8 *)(local_3570[2] + 0x18);
        local_3418 = local_3578;
        local_30a0 = *(undefined8 *)*local_3578;
        uStack_3098 = *(undefined8 *)(*local_3578 + 8);
        uStack_3090 = *(undefined8 *)(*local_3578 + 0x10);
        uStack_3088 = *(undefined8 *)(*local_3578 + 0x18);
        local_3420 = local_3578 + 1;
        local_3100 = *(undefined8 *)*local_3420;
        uStack_30f8 = *(undefined8 *)(local_3578[1] + 8);
        uStack_30f0 = *(undefined8 *)(local_3578[1] + 0x10);
        uStack_30e8 = *(undefined8 *)(local_3578[1] + 0x18);
        local_3428 = local_3578 + 2;
        local_3160 = *(undefined8 *)*local_3428;
        uStack_3158 = *(undefined8 *)(local_3578[2] + 8);
        uStack_3150 = *(undefined8 *)(local_3578[2] + 0x10);
        uStack_3148 = *(undefined8 *)(local_3578[2] + 0x18);
        local_3430 = local_3580;
        local_31c0 = *(undefined8 *)*local_3580;
        uStack_31b8 = *(undefined8 *)(*local_3580 + 8);
        uStack_31b0 = *(undefined8 *)(*local_3580 + 0x10);
        uStack_31a8 = *(undefined8 *)(*local_3580 + 0x18);
        local_3438 = local_3580 + 1;
        local_3220 = *(undefined8 *)*local_3438;
        uStack_3218 = *(undefined8 *)(local_3580[1] + 8);
        uStack_3210 = *(undefined8 *)(local_3580[1] + 0x10);
        uStack_3208 = *(undefined8 *)(local_3580[1] + 0x18);
        local_3440 = local_3580 + 2;
        local_3280 = *(undefined8 *)*local_3440;
        uStack_3278 = *(undefined8 *)(local_3580[2] + 8);
        uStack_3270 = *(undefined8 *)(local_3580[2] + 0x10);
        uStack_3268 = *(undefined8 *)(local_3580[2] + 0x18);
        local_2f60 = local_3ec0;
        uStack_2f58 = uStack_3eb8;
        uStack_2f50 = uStack_3eb0;
        uStack_2f48 = uStack_3ea8;
        local_2fa0 = local_3500;
        uStack_2f98 = uStack_34f8;
        uStack_2f90 = uStack_34f0;
        uStack_2f88 = uStack_34e8;
        local_360 = local_3ec0;
        uStack_358 = uStack_3eb8;
        uStack_350 = uStack_3eb0;
        uStack_348 = uStack_3ea8;
        local_3a0 = local_3500;
        uStack_398 = uStack_34f8;
        uStack_390 = uStack_34f0;
        uStack_388 = uStack_34e8;
        auVar16._8_8_ = uStack_34f8;
        auVar16._0_8_ = local_3500;
        auVar16._16_8_ = uStack_34f0;
        auVar16._24_8_ = uStack_34e8;
        auVar9 = vfmadd213ps_fma(*local_3570,auVar24,auVar16);
        local_4d00 = auVar9._0_8_;
        uStack_4cf8 = auVar9._8_8_;
        local_2fc0 = local_3ee0;
        uStack_2fb8 = uStack_3ed8;
        uStack_2fb0 = uStack_3ed0;
        uStack_2fa8 = uStack_3ec8;
        local_3000 = local_4d00;
        uStack_2ff8 = uStack_4cf8;
        uStack_2ff0 = 0;
        uStack_2fe8 = 0;
        local_300 = local_3ee0;
        uStack_2f8 = uStack_3ed8;
        uStack_2f0 = uStack_3ed0;
        uStack_2e8 = uStack_3ec8;
        local_340 = local_4d00;
        uStack_338 = uStack_4cf8;
        uStack_330 = 0;
        uStack_328 = 0;
        auVar9 = vfmadd213ps_fma(*local_3408,auVar1,ZEXT1632(auVar9));
        local_4d20 = auVar9._0_8_;
        uStack_4d18 = auVar9._8_8_;
        local_3020 = local_3f00;
        uStack_3018 = uStack_3ef8;
        uStack_3010 = uStack_3ef0;
        uStack_3008 = uStack_3ee8;
        local_3060 = local_4d20;
        uStack_3058 = uStack_4d18;
        uStack_3050 = 0;
        uStack_3048 = 0;
        local_2a0 = local_3f00;
        uStack_298 = uStack_3ef8;
        uStack_290 = uStack_3ef0;
        uStack_288 = uStack_3ee8;
        local_2e0 = local_4d20;
        uStack_2d8 = uStack_4d18;
        uStack_2d0 = 0;
        uStack_2c8 = 0;
        auVar9 = vfmadd213ps_fma(*local_3410,auVar2,ZEXT1632(auVar9));
        local_4d40 = auVar9._0_8_;
        uStack_4d38 = auVar9._8_8_;
        local_3080 = local_3f20;
        uStack_3078 = uStack_3f18;
        uStack_3070 = uStack_3f10;
        uStack_3068 = uStack_3f08;
        local_30c0 = local_4d40;
        uStack_30b8 = uStack_4d38;
        uStack_30b0 = 0;
        uStack_30a8 = 0;
        local_240 = local_3f20;
        uStack_238 = uStack_3f18;
        uStack_230 = uStack_3f10;
        uStack_228 = uStack_3f08;
        local_280 = local_4d40;
        uStack_278 = uStack_4d38;
        uStack_270 = 0;
        uStack_268 = 0;
        auVar9 = vfmadd213ps_fma(*local_3578,auVar3,ZEXT1632(auVar9));
        local_4d60 = auVar9._0_8_;
        uStack_4d58 = auVar9._8_8_;
        local_30e0 = local_3f40;
        uStack_30d8 = uStack_3f38;
        uStack_30d0 = uStack_3f30;
        uStack_30c8 = uStack_3f28;
        local_3120 = local_4d60;
        uStack_3118 = uStack_4d58;
        uStack_3110 = 0;
        uStack_3108 = 0;
        local_1e0 = local_3f40;
        uStack_1d8 = uStack_3f38;
        uStack_1d0 = uStack_3f30;
        uStack_1c8 = uStack_3f28;
        local_220 = local_4d60;
        uStack_218 = uStack_4d58;
        uStack_210 = 0;
        uStack_208 = 0;
        auVar9 = vfmadd213ps_fma(*local_3420,auVar4,ZEXT1632(auVar9));
        local_4d80 = auVar9._0_8_;
        uStack_4d78 = auVar9._8_8_;
        local_3140 = local_3f60;
        uStack_3138 = uStack_3f58;
        uStack_3130 = uStack_3f50;
        uStack_3128 = uStack_3f48;
        local_3180 = local_4d80;
        uStack_3178 = uStack_4d78;
        uStack_3170 = 0;
        uStack_3168 = 0;
        local_180 = local_3f60;
        uStack_178 = uStack_3f58;
        uStack_170 = uStack_3f50;
        uStack_168 = uStack_3f48;
        local_1c0 = local_4d80;
        uStack_1b8 = uStack_4d78;
        uStack_1b0 = 0;
        uStack_1a8 = 0;
        auVar9 = vfmadd213ps_fma(*local_3428,auVar5,ZEXT1632(auVar9));
        local_4da0 = auVar9._0_8_;
        uStack_4d98 = auVar9._8_8_;
        local_31a0 = local_3f80;
        uStack_3198 = uStack_3f78;
        uStack_3190 = uStack_3f70;
        uStack_3188 = uStack_3f68;
        local_31e0 = local_4da0;
        uStack_31d8 = uStack_4d98;
        uStack_31d0 = 0;
        uStack_31c8 = 0;
        local_120 = local_3f80;
        uStack_118 = uStack_3f78;
        uStack_110 = uStack_3f70;
        uStack_108 = uStack_3f68;
        local_160 = local_4da0;
        uStack_158 = uStack_4d98;
        uStack_150 = 0;
        uStack_148 = 0;
        auVar9 = vfmadd213ps_fma(*local_3580,auVar6,ZEXT1632(auVar9));
        local_4dc0 = auVar9._0_8_;
        uStack_4db8 = auVar9._8_8_;
        local_3200 = local_3fa0;
        uStack_31f8 = uStack_3f98;
        uStack_31f0 = uStack_3f90;
        uStack_31e8 = uStack_3f88;
        local_3240 = local_4dc0;
        uStack_3238 = uStack_4db8;
        uStack_3230 = 0;
        uStack_3228 = 0;
        local_c0 = local_3fa0;
        uStack_b8 = uStack_3f98;
        uStack_b0 = uStack_3f90;
        uStack_a8 = uStack_3f88;
        local_100 = local_4dc0;
        uStack_f8 = uStack_4db8;
        uStack_f0 = 0;
        uStack_e8 = 0;
        auVar9 = vfmadd213ps_fma(*local_3438,auVar7,ZEXT1632(auVar9));
        local_4de0 = auVar9._0_8_;
        this = (Mat *)0x0;
        local_3260 = local_3fc0;
        uStack_3258 = uStack_3fb8;
        uStack_3250 = uStack_3fb0;
        uStack_3248 = uStack_3fa8;
        local_32a0 = local_4de0;
        uStack_3288 = 0;
        local_60 = local_3fc0;
        uStack_58 = uStack_3fb8;
        uStack_50 = uStack_3fb0;
        uStack_48 = uStack_3fa8;
        local_a0 = local_4de0;
        uStack_88 = 0;
        auVar10 = vfmadd213ps_fma(*local_3440,auVar8,ZEXT1632(auVar9));
        local_4e00 = auVar10._0_8_;
        uStack_4df8 = auVar10._8_8_;
        local_1ac8 = local_3520;
        local_1b00 = local_4e00;
        uStack_1af8 = uStack_4df8;
        uStack_1af0 = 0;
        uStack_1ae8 = 0;
        *(undefined8 *)local_3520 = local_4e00;
        *(undefined8 *)(local_3520 + 2) = uStack_4df8;
        local_1ac8[4] = 0.0;
        local_1ac8[5] = 0.0;
        local_1ac8[6] = 0.0;
        local_1ac8[7] = 0.0;
        local_3570 = local_3570 + 2;
        local_3578 = local_3578 + 2;
        local_3580 = local_3580 + 2;
        local_3520 = local_3520 + 8;
        auVar23 = ZEXT1632(auVar9);
        uStack_3298 = auVar9._8_8_;
        uStack_3290 = this;
        local_380 = local_2f80;
        uStack_378 = uStack_2f78;
        uStack_370 = uStack_2f70;
        uStack_368 = uStack_2f68;
        local_320 = local_2fe0;
        uStack_318 = uStack_2fd8;
        uStack_310 = uStack_2fd0;
        uStack_308 = uStack_2fc8;
        local_2c0 = local_3040;
        uStack_2b8 = uStack_3038;
        uStack_2b0 = uStack_3030;
        uStack_2a8 = uStack_3028;
        local_260 = local_30a0;
        uStack_258 = uStack_3098;
        uStack_250 = uStack_3090;
        uStack_248 = uStack_3088;
        local_200 = local_3100;
        uStack_1f8 = uStack_30f8;
        uStack_1f0 = uStack_30f0;
        uStack_1e8 = uStack_30e8;
        local_1a0 = local_3160;
        uStack_198 = uStack_3158;
        uStack_190 = uStack_3150;
        uStack_188 = uStack_3148;
        local_140 = local_31c0;
        uStack_138 = uStack_31b8;
        uStack_130 = uStack_31b0;
        uStack_128 = uStack_31a8;
        local_e0 = local_3220;
        uStack_d8 = uStack_3218;
        uStack_d0 = uStack_3210;
        uStack_c8 = uStack_3208;
        uStack_98 = auVar9._8_8_;
        uStack_90 = this;
        local_80 = local_3280;
        uStack_78 = uStack_3278;
        uStack_70 = uStack_3270;
        uStack_68 = uStack_3268;
      }
      local_3570 = (undefined1 (*) [32])(*local_3570 + (long)local_3484 * 4);
      local_3578 = (undefined1 (*) [32])(*local_3578 + (long)local_3484 * 4);
      local_3580 = (undefined1 (*) [32])(*local_3580 + (long)local_3484 * 4);
    }
    local_1860 = local_1910;
    local_1858 = local_1918;
    local_1850 = local_1920;
    local_1848 = local_1928;
    local_1840 = local_1930;
    local_1838 = local_1938;
    local_1830 = local_1940;
    local_1828 = local_1948;
    Mat::~Mat((Mat *)0x649241);
    Mat::~Mat((Mat *)0x64924e);
  }
  return;
}

Assistant:

static void convdw3x3s2_fp16_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = (w - 2 * outw + w) * 8;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + g * 8) : _mm256_set1_ps(0.f);

        const unsigned short* k0 = (const unsigned short*)kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m256 _k00 = loadfp16(k0);
        __m256 _k01 = loadfp16(k0 + 8);
        __m256 _k02 = loadfp16(k0 + 16);
        __m256 _k10 = loadfp16(k0 + 24);
        __m256 _k11 = loadfp16(k0 + 32);
        __m256 _k12 = loadfp16(k0 + 40);
        __m256 _k20 = loadfp16(k0 + 48);
        __m256 _k21 = loadfp16(k0 + 56);
        __m256 _k22 = loadfp16(k0 + 64);

        int i = 0;

        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r04, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r14, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r24, _sum1);

                __m256 _sum2 = _bias0;
                __m256 _r05 = _mm256_loadu_ps(r0 + 40);
                __m256 _r15 = _mm256_loadu_ps(r1 + 40);
                __m256 _r25 = _mm256_loadu_ps(r2 + 40);
                __m256 _r06 = _mm256_loadu_ps(r0 + 48);
                __m256 _r16 = _mm256_loadu_ps(r1 + 48);
                __m256 _r26 = _mm256_loadu_ps(r2 + 48);
                _mm256_storeu_ps(outptr0 + 8, _sum1);

                _sum2 = _mm256_comp_fmadd_ps(_k00, _r04, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r05, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r06, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r14, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r15, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r16, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r24, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r25, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r26, _sum2);

                __m256 _sum3 = _bias0;
                __m256 _r07 = _mm256_loadu_ps(r0 + 56);
                __m256 _r17 = _mm256_loadu_ps(r1 + 56);
                __m256 _r27 = _mm256_loadu_ps(r2 + 56);
                __m256 _r08 = _mm256_loadu_ps(r0 + 64);
                __m256 _r18 = _mm256_loadu_ps(r1 + 64);
                __m256 _r28 = _mm256_loadu_ps(r2 + 64);
                _mm256_storeu_ps(outptr0 + 16, _sum2);

                _sum3 = _mm256_comp_fmadd_ps(_k00, _r06, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r07, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r08, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r16, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r17, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r18, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r26, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r27, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r28, _sum3);

                _mm256_storeu_ps(outptr0 + 24, _sum3);

                r0 += 2 * 32;
                r1 += 2 * 32;
                r2 += 2 * 32;
                outptr0 += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r04, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r14, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r24, _sum1);

                _mm256_storeu_ps(outptr0 + 8, _sum1);

                r0 += 2 * 16;
                r1 += 2 * 16;
                r2 += 2 * 16;
                outptr0 += 16;
            }
            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _mm256_storeu_ps(outptr0, _sum0);
                r0 += 2 * 8;
                r1 += 2 * 8;
                r2 += 2 * 8;
                outptr0 += 8;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}